

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInternalForces
          (ChElementShellReissner4 *this,ChVectorDynamic<> *Fi)

{
  ulong *puVar1;
  ChVectorN<double,_12> *pCVar2;
  ChMatrix33<double> *pCVar3;
  long lVar4;
  Matrix<double,_3,_3,_1,_3,_3> *pMVar5;
  ChVector<double> *pCVar6;
  PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_> *pPVar7;
  undefined8 *puVar8;
  double dVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long *plVar27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  pointer pdVar29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [56];
  undefined1 auVar52 [56];
  undefined1 auVar53 [16];
  long lVar54;
  ChMatrix33<double> (*paCVar55) [4];
  byte bVar56;
  uint uVar57;
  Index index;
  double *pdVar58;
  ulong __n;
  XprTypeNested *ppMVar59;
  double *pdVar60;
  double *pdVar61;
  pointer pLVar62;
  uint uVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  char *__function;
  Index outer;
  double *pdVar67;
  long lVar68;
  long lVar69;
  undefined1 *puVar70;
  ulong uVar71;
  int iVar72;
  long lVar73;
  PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *pPVar74;
  variable_if_dynamic<long,__1> *pvVar75;
  ChMatrixNM<double,_12,_24> *pCVar76;
  double *pdVar77;
  ulong *puVar78;
  ulong uVar79;
  long lVar80;
  long lVar81;
  undefined1 *puVar82;
  ulong uVar83;
  ChMatrixNM<double,_4,_2> *pCVar84;
  ChMatrixNM<double,_15,_24> *pCVar85;
  uint uVar86;
  uint uVar87;
  LhsNested actual_lhs;
  int i;
  ulong uVar88;
  void *pvVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  double dVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  Index alignedStart_1;
  Index alignedEnd;
  Scalar *dst_ptr;
  ChVector<double> phi_tilde_1_i;
  ChVectorN<double,_12> strain_dt;
  Scalar *dst_ptr_1;
  ChStateDelta velocities;
  Index alignedStart_2;
  ChMatrixNM<double,_1,_4> sh1;
  ChVector<double> phi_tilde_2_i;
  ChVector<double> l_m2_1;
  ChVector<double> l_m1_1;
  ChVectorN<double,_12> stress_damp;
  ChVector<double> eps_tot_2;
  ChVector<double> eps_tot_1;
  ChVector<double> l_n1;
  ChVector<double> k_tot_2;
  ChVector<double> k_tot_1;
  DstEvaluatorType dstEvaluator;
  ChVector<double> y_A_2;
  ChVector<double> y_A_1;
  ChVector<double> l_m2;
  ChVector<double> l_m1;
  ChVector<double> l_n2;
  ChMatrix33<double> T_3;
  ChVectorN<double,_24> rd;
  ChMatrixNM<double,_6,_24> B_overline_A;
  ChMatrixNM<double,_4,_24> B_overline_6_ABCD;
  ChMatrixNM<double,_4,_24> B_overline_3_ABCD;
  undefined1 local_1430 [80];
  Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> local_13e0;
  undefined8 uStack_13a8;
  PointerType local_13a0;
  double *local_1390;
  double dStack_1388;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  ChMatrixNM<double,_4,_2> *local_1360;
  ulong uStack_1358;
  variable_if_dynamic<long,__1> *local_1350;
  ulong uStack_1348;
  ChMatrix33<double> local_1340;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1> *local_12b0;
  ulong uStack_12a8;
  undefined1 local_1298 [16];
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_1288;
  LhsNested LStack_1280;
  double *pdStack_1278;
  undefined1 auStack_1270 [16];
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 *local_1220;
  ulong uStack_1218;
  ChMatrixNM<double,_15,_24> *local_1210;
  ChVector<double> *local_1208;
  Matrix<double,_3,_3,_1,_3,_3> local_1200;
  undefined1 *puStack_11b8;
  undefined8 uStack_11b0;
  Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *pBStack_11a8;
  undefined8 uStack_11a0;
  undefined1 *puStack_1198;
  undefined8 uStack_1190;
  undefined1 *puStack_1188;
  undefined8 local_1180;
  undefined1 *puStack_1178;
  undefined8 uStack_1170;
  double *pdStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1130 [16];
  double *pdStack_1120;
  Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *pBStack_1118;
  undefined1 auStack_1110 [32];
  undefined8 local_10f0;
  undefined1 local_10e0 [16];
  double local_10d0;
  undefined1 local_10c0 [16];
  double local_10b0;
  ChVectorDynamic<> *local_10a0;
  ChMatrixNM<double,_12,_24> *local_1098;
  ChVector<double> *local_1090;
  ChVector<double> *local_1088;
  Matrix<double,_3,_3,_1,_3,_3> local_1080;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  blas_data_mapper<const_double,_long,_0,_0,_1> local_1020;
  double local_1010;
  ChVector<double> local_1000;
  ChVector<double> local_fe0;
  ChVector<double> *local_fc8;
  ChVector<double> *local_fc0;
  ChMatrix33<double> *local_fb8;
  ChVector<double> *local_fb0;
  ChVector<double> *local_fa8;
  ChVector<double> *local_fa0;
  ChVector<double> *local_f98;
  ChVector<double> *local_f90;
  ChVector<double> *local_f88;
  ChMatrixNM<double,_15,_24> *local_f80;
  ChMatrixNM<double,_4,_2> *local_f78;
  double *local_f70;
  double *local_f68;
  double *local_f60;
  double *local_f58;
  double *local_f50;
  variable_if_dynamic<long,__1> *local_f48;
  undefined1 local_f40 [96];
  const_blas_data_mapper<double,_long,_1> local_ee0;
  double local_ed0;
  ChVector<double> local_ec0;
  ChVector<double> local_ea0;
  undefined1 local_e88 [32];
  double dStack_e68;
  undefined1 auStack_e60 [24];
  double local_e48;
  double local_e40;
  double dStack_e38;
  double dStack_e30;
  undefined8 uStack_e28;
  double dStack_e20;
  undefined1 auStack_e18 [24];
  double local_e00;
  ChVector<double> local_df0;
  ChVector<double> local_dd0;
  ChMatrixNM<double,_15,_24> *local_db0;
  ChVector<double> *local_da8;
  ChVector<double> *local_da0;
  ChVector<double> *local_d98;
  ChVector<double> *local_d90;
  ChMatrixNM<double,_4,_2> *local_d88;
  long local_d80;
  double *local_d78;
  ChMatrix33<double> (*local_d70) [4];
  ChMatrix33<double> (*local_d68) [4];
  ChVector<double> *local_d60;
  ChMatrix33<double> (*local_d58) [4];
  undefined8 *local_d50;
  long local_d48;
  long local_d40;
  long local_d38;
  double *local_d30;
  long local_d28;
  double local_d20;
  double dStack_d18;
  double local_d10;
  double local_d00;
  double dStack_cf8;
  double local_cf0;
  double local_ce0;
  double dStack_cd8;
  double local_cd0;
  undefined1 local_cc8 [64];
  undefined8 local_c88;
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [24];
  double dStack_ba8;
  long lStack_ba0;
  double adStack_b98 [2];
  long lStack_b88;
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> local_b00;
  undefined8 uStack_ac8;
  double local_ac0;
  double local_980;
  double dStack_978;
  double dStack_970;
  ulong uStack_968;
  ulong uStack_960;
  ulong uStack_958;
  ulong uStack_950;
  ulong uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [24];
  undefined1 local_8a8 [360];
  double local_740;
  double dStack_738;
  double dStack_730;
  ulong uStack_728;
  ulong uStack_720;
  ulong uStack_718;
  ulong uStack_710;
  ulong uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  double local_680 [4];
  undefined8 uStack_660;
  ulong auStack_658 [4];
  undefined1 auStack_638 [56];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  double local_380 [4];
  undefined8 uStack_360;
  ulong auStack_358 [4];
  undefined1 auStack_338 [56];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  lVar73 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar73 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_10a0 = Fi;
  if (lVar73 != 0) {
    memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar73 << 3);
  }
  UpdateNodalAndAveragePosAndOrientation(this);
  InterpolateOrientation(this);
  ComputeIPCurvature(this);
  local_d88 = this->L_alpha_beta_i;
  local_fb0 = this->y_i_1;
  local_f88 = this->xa;
  pCVar85 = this->D_overline_i;
  pvVar75 = (variable_if_dynamic<long,__1> *)
            (this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
             m_storage.m_data.array + 3);
  pdVar60 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0xdb;
  pdVar77 = this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
            m_storage.m_data.array + 0x48;
  pdVar61 = this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
            m_storage.m_data.array + 0x93;
  pdVar58 = this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
            m_storage.m_data.array + 0xdb;
  pCVar84 = (ChMatrixNM<double,_4,_2> *)
            (this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
             m_storage.m_data.array + 0x123);
  lVar73 = 0;
  local_1090 = this->y_i_2;
  local_fb8 = this->T_i;
  local_f90 = this->eps_tilde_1_i;
  local_d90 = this->eps_tilde_1_0_i;
  local_f98 = this->eps_tilde_2_i;
  local_d98 = this->eps_tilde_2_0_i;
  local_fc0 = this->k_1_i;
  local_fa0 = this->k_tilde_1_i;
  local_da0 = this->k_tilde_1_0_i;
  local_fc8 = this->k_2_i;
  local_fa8 = this->k_tilde_2_i;
  local_da8 = this->k_tilde_2_0_i;
  local_d58 = this->Phi_Delta_i;
  local_1098 = this->B_overline_i;
  local_d60 = this->phi_tilde_n;
  local_d68 = this->Kappa_delta_i_1;
  local_d70 = this->Kappa_delta_i_2;
  pdVar67 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0x93;
  pdVar64 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0x4b;
  local_db0 = pCVar85;
  do {
    pCVar6 = local_fb0;
    local_1250._0_8_ = local_d88 + lVar73;
    local_f80 = pCVar85;
    local_f78 = pCVar84;
    local_f70 = pdVar58;
    local_f68 = pdVar61;
    local_f60 = pdVar77;
    local_f58 = pdVar67;
    local_f50 = pdVar64;
    local_f48 = pvVar75;
    InterpDeriv(local_f88,local_d88 + lVar73,local_fb0 + lVar73,local_1090 + lVar73);
    auVar97 = _local_bc0;
    local_d48 = lVar73 * 9;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = pCVar6[lVar73].m_data[1];
    auVar125._8_8_ = pCVar6[lVar73].m_data[0];
    auVar125._0_8_ = pCVar6[lVar73].m_data[0];
    auVar132._8_8_ = pCVar6[lVar73].m_data[2];
    auVar132._0_8_ = pCVar6[lVar73].m_data[2];
    pCVar3 = local_fb8 + lVar73;
    pCVar76 = local_1098 + lVar73;
    auVar137._8_8_ = 0;
    auVar137._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_12c0._0_8_ = pCVar3;
    auVar92._8_8_ = 0;
    auVar92._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar118._8_8_ = 0;
    auVar118._0_8_ =
         pCVar6[lVar73].m_data[1] *
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar92 = vfmadd231sd_fma(auVar118,auVar125,auVar92);
    auVar90._8_8_ = 0;
    auVar90._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar93 = vfmadd231sd_fma(auVar92,auVar132,auVar90);
    auVar90 = vunpcklpd_avx(auVar137,auVar108);
    auVar92 = vmovhpd_avx(auVar108,(pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[4]);
    local_c80._0_8_ = local_f58;
    dVar107 = local_d90[lVar73].m_data[2];
    auVar109._0_8_ = auVar90._0_8_ * auVar92._0_8_;
    auVar109._8_8_ = auVar90._8_8_ * auVar92._8_8_;
    auVar92 = vfmadd231pd_fma(auVar109,auVar125,
                              *(undefined1 (*) [16])
                               (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar92 = vfmadd231pd_fma(auVar92,auVar132,
                              *(undefined1 (*) [16])
                               ((pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    auVar92 = vsubpd_avx(auVar92,*(undefined1 (*) [16])local_d90[lVar73].m_data);
    *(undefined1 (*) [16])local_f90[lVar73].m_data = auVar92;
    local_f90[lVar73].m_data[2] = auVar93._0_8_ - dVar107;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_1090[lVar73].m_data[1];
    auVar138._8_8_ = 0;
    auVar138._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar126._8_8_ = local_1090[lVar73].m_data[0];
    auVar126._0_8_ = local_1090[lVar73].m_data[0];
    auVar133._8_8_ = local_1090[lVar73].m_data[2];
    auVar133._0_8_ = local_1090[lVar73].m_data[2];
    auVar93._8_8_ = 0;
    auVar93._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar119._8_8_ = 0;
    auVar119._0_8_ =
         local_1090[lVar73].m_data[1] *
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar93 = vfmadd231sd_fma(auVar119,auVar126,auVar93);
    auVar90 = vunpcklpd_avx(auVar138,auVar110);
    auVar92 = vmovhpd_avx(auVar110,(pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[4]);
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar93 = vfmadd231sd_fma(auVar93,auVar133,auVar91);
    dVar107 = local_d98[lVar73].m_data[2];
    auVar111._0_8_ = auVar90._0_8_ * auVar92._0_8_;
    auVar111._8_8_ = auVar90._8_8_ * auVar92._8_8_;
    auVar92 = vfmadd231pd_fma(auVar111,auVar126,
                              *(undefined1 (*) [16])
                               (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar92 = vfmadd231pd_fma(auVar92,auVar133,
                              *(undefined1 (*) [16])
                               ((pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    auVar92 = vsubpd_avx(auVar92,*(undefined1 (*) [16])local_d98[lVar73].m_data);
    *(undefined1 (*) [16])local_f98[lVar73].m_data = auVar92;
    local_f98[lVar73].m_data[2] = auVar93._0_8_ - dVar107;
    auVar139._8_8_ = 0;
    auVar139._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_fc0[lVar73].m_data[1];
    auVar127._8_8_ = local_fc0[lVar73].m_data[0];
    auVar127._0_8_ = local_fc0[lVar73].m_data[0];
    auVar134._8_8_ = local_fc0[lVar73].m_data[2];
    auVar134._0_8_ = local_fc0[lVar73].m_data[2];
    auVar94._8_8_ = 0;
    auVar94._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar120._8_8_ = 0;
    auVar120._0_8_ =
         local_fc0[lVar73].m_data[1] *
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar93 = vfmadd231sd_fma(auVar120,auVar127,auVar94);
    auVar90 = vunpcklpd_avx(auVar139,auVar112);
    auVar92 = vmovhpd_avx(auVar112,(pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[4]);
    auVar95._8_8_ = 0;
    auVar95._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar93 = vfmadd231sd_fma(auVar93,auVar134,auVar95);
    dVar107 = local_da0[lVar73].m_data[2];
    auVar113._0_8_ = auVar90._0_8_ * auVar92._0_8_;
    auVar113._8_8_ = auVar90._8_8_ * auVar92._8_8_;
    auVar92 = vfmadd231pd_fma(auVar113,auVar127,
                              *(undefined1 (*) [16])
                               (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar92 = vfmadd231pd_fma(auVar92,auVar134,
                              *(undefined1 (*) [16])
                               ((pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    auVar92 = vsubpd_avx(auVar92,*(undefined1 (*) [16])local_da0[lVar73].m_data);
    *(undefined1 (*) [16])local_fa0[lVar73].m_data = auVar92;
    local_fa0[lVar73].m_data[2] = auVar93._0_8_ - dVar107;
    dVar107 = local_da8[lVar73].m_data[2];
    auVar114._8_8_ = 0;
    auVar114._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar128._8_8_ = 0;
    auVar128._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar152._8_8_ = 0;
    auVar152._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    dVar9 = local_fc8[lVar73].m_data[2];
    auVar143._8_8_ = dVar9;
    auVar143._0_8_ = dVar9;
    local_380[0] = 0.0;
    local_380[3] = pCVar6[lVar73].m_data[2];
    local_1350 = local_f48;
    lVar81 = 0;
    auVar159._0_8_ = -local_380[3];
    auVar159._8_8_ = 0x8000000000000000;
    local_380[1] = (double)vmovlpd_avx(auVar159);
    uStack_360 = 0;
    auVar92 = *(undefined1 (*) [16])pCVar6[lVar73].m_data;
    local_380[2] = pCVar6[lVar73].m_data[1];
    local_680[0] = 0.0;
    auStack_358[0] = auVar92._0_8_ ^ 0x8000000000000000;
    auStack_358[1] = auVar92._8_8_ ^ 0x8000000000000000;
    auStack_358[2] = vmovlpd_avx(auVar92);
    auStack_358[3] = 0;
    local_680[3] = local_1090[lVar73].m_data[2];
    auVar160._0_8_ = -local_680[3];
    auVar160._8_8_ = 0x8000000000000000;
    local_680[1] = (double)vmovlpd_avx(auVar160);
    uStack_660 = 0;
    auVar92 = *(undefined1 (*) [16])local_1090[lVar73].m_data;
    local_680[2] = local_1090[lVar73].m_data[1];
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    auStack_658[0] = auVar92._0_8_ ^ 0x8000000000000000;
    auStack_658[1] = auVar92._8_8_ ^ 0x8000000000000000;
    auStack_658[2] = vmovlpd_avx(auVar92);
    auStack_658[3] = 0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = local_fc0[lVar73].m_data[2];
    auVar161._0_8_ =
         -local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3];
    auVar161._8_8_ = 0x8000000000000000;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar161);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    auVar92 = *(undefined1 (*) [16])local_fc0[lVar73].m_data;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = local_fc0[lVar73].m_data[1];
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = -auVar92._0_8_;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = -auVar92._8_8_;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = (double)vmovlpd_avx(auVar92);
    auVar156._0_8_ = -dVar9;
    auVar156._8_8_ = -dVar9;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    uVar10 = vmovlpd_avx(auVar156);
    auVar51._8_48_ = stack0xfffffffffffff450;
    auVar51._0_8_ = uVar10;
    local_bc0 = auVar51._0_24_ << 0x40;
    dStack_ba8 = (double)vmovlpd_avx(auVar143);
    _adStack_b98 = auVar97._40_24_;
    lStack_ba0 = 0;
    dVar9 = local_fc8[lVar73].m_data[1];
    auVar162._8_8_ = dVar9;
    auVar162._0_8_ = dVar9;
    auVar92 = *(undefined1 (*) [16])local_fc8[lVar73].m_data;
    auVar121._8_8_ = 0;
    auVar121._0_8_ =
         dVar9 * (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar90 = vfmadd231sd_fma(auVar121,auVar92,auVar114);
    auVar93 = vfmadd231sd_fma(auVar90,auVar143,auVar128);
    auVar90 = vunpcklpd_avx(auVar162,auVar152);
    auVar122._0_8_ =
         (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
         auVar90._0_8_;
    auVar122._8_8_ = auVar92._8_8_ * auVar90._8_8_;
    auVar38._8_8_ = local_fc8[lVar73].m_data[0];
    auVar38._0_8_ = local_fc8[lVar73].m_data[0];
    auVar90 = vfmadd231pd_avx512vl
                        (auVar122,*(undefined1 (*) [16])
                                   (pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array,auVar38);
    local_1360 = local_f78;
    local_1370._0_8_ = local_f70;
    auVar90 = vfmadd231pd_fma(auVar90,auVar143,
                              *(undefined1 (*) [16])
                               ((pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    auVar90 = vsubpd_avx(auVar90,*(undefined1 (*) [16])local_da8[lVar73].m_data);
    local_c00._0_8_ = local_f68;
    *(undefined1 (*) [16])local_fa8[lVar73].m_data = auVar90;
    local_fa8[lVar73].m_data[2] = auVar93._0_8_ - dVar107;
    local_d50 = &xi_i + lVar73 * 2;
    uVar10 = vmovlpd_avx(auVar162);
    local_bc0._16_8_ = uVar10;
    adStack_b98[0] = (double)(auVar92._0_8_ ^ 0x8000000000000000);
    adStack_b98[1] = -auVar92._8_8_;
    lStack_b88 = vmovlpd_avx(auVar92);
    auVar97._56_8_ = 0;
    auVar97._0_56_ = local_b80._8_56_;
    local_b80 = auVar97 << 0x40;
    local_12d0._0_8_ = local_f60;
    lVar69 = 0;
    local_1210 = local_db0 + lVar73;
    local_c40._0_8_ = local_f80;
    bVar56 = 4;
    pdVar77 = local_f50;
    local_d80 = lVar73;
    local_d78 = pdVar60;
    do {
      lVar73 = local_d48;
      paCVar55 = local_d58;
      local_1088 = (ChVector<double> *)CONCAT71(local_1088._1_7_,bVar56);
      uVar87 = (bVar56 & 7) + 1;
      if (2 < uVar87) {
        uVar87 = 3;
      }
      uVar63 = (uint)lVar69 & 6;
      if (2 < uVar63) {
        uVar63 = 3;
      }
      uVar88 = (ulong)(-((int)lVar81 * 0x30 + 0x18U >> 3) & 7);
      if (2 < uVar88) {
        uVar88 = 3;
      }
      uVar71 = 2;
      if (2 < uVar88) {
        uVar71 = uVar88;
      }
      local_1380._0_8_ = uVar71;
      uVar86 = -((uint)((int)lVar81 * 0x30) >> 3) & 6;
      if (2 < uVar86) {
        uVar86 = 3;
      }
      uVar57 = 2;
      if (2 < uVar86) {
        uVar57 = uVar86;
      }
      local_d28 = lVar69;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = (double)(*(code *)(&LI)[lVar81])(local_d50);
      pdVar61 = (*paCVar55)[lVar81].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + lVar73 * 4;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar61;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [1] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar61[1];
      lVar65 = lVar81 * 0x10;
      pdVar61 = (*paCVar55)[lVar81].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + lVar73 * 4 + 2;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [2] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar61;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [3] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar61[1];
      pdVar61 = (*paCVar55)[lVar81].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + lVar73 * 4 + 4;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [4] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar61;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [5] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar61[1];
      pdVar61 = (*paCVar55)[lVar81].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + lVar73 * 4 + 6;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [6] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar61;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [7] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar61[1];
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] *
            (*paCVar55)[lVar81].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [lVar73 * 4 + 8];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           *(double *)(local_1250._0_8_ + lVar65);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 8);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)local_12c0._0_8_;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x10);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x18);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x20);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x28);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x30);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x38);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x40);
      local_1298._0_8_ = &local_1340;
      lVar69 = lVar81 * 6;
      pdVar61 = (pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>).
                m_storage.m_data.array + lVar81 * 6;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startRow.m_value = 0;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_outerStride = 0x18;
      local_1208 = (ChVector<double> *)(lVar81 * 9);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = pdVar61;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.m_xpr =
           pCVar76;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startCol.m_value = lVar69;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                (&local_b00,(Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1298);
      auVar97 = local_f40._0_64_;
      pvVar75 = local_1350;
      auVar92 = local_1380;
      if (((undefined1 *)
           local_b00.
           super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
           m_rows.m_value != (undefined1 *)0x3) ||
         ((Matrix<double,_3,_3,_1,_3,_3> *)
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_cols.m_value != (Matrix<double,_3,_3,_1,_3,_3> *)0x3)) {
LAB_0078f0f9:
        __function = 
        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 12, 24, 1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 12, 24, 1>>]"
        ;
        goto LAB_0078f10e;
      }
      uVar83 = (ulong)(uVar87 << 3);
      lVar68 = 0;
      lVar54 = uVar83 - 0x1340;
      local_1220 = (undefined1 *)
                   ((long)(local_1360->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>)
                          .m_storage.m_data.array + uVar83);
      local_1230._0_8_ = local_1370._0_8_ + uVar83;
      local_1240._0_8_ = local_c00._0_8_ + uVar83;
      uVar71 = (ulong)(uVar63 << 3);
      local_12b0 = (MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                    *)(local_12d0._0_8_ + uVar71);
      lVar66 = uVar71 + local_c40._0_8_;
      local_d40 = (long)pdVar60 + uVar83;
      lVar4 = local_c80._0_8_ + uVar83;
      local_f40._4_4_ = 0;
      local_f40._0_4_ = (int)uVar88 * 8;
      local_f40._8_56_ = auVar97._8_56_;
      local_1390 = (double *)((long)pdVar77 + uVar83);
      local_1380._4_4_ = 0;
      local_1380._0_4_ = uVar86 * 8;
      uVar79 = (ulong)((auVar92._0_4_ - (int)uVar88) * 8 + 8);
      local_1380._8_8_ = auVar92._8_8_;
      uVar88 = (ulong)((uVar57 - uVar86) * 8 + 8);
      pdVar58 = (double *)local_1298._0_8_;
      do {
        lVar80 = 0;
        pdVar67 = pdVar58;
        do {
          uVar10 = *pdVar67;
          pdVar67 = pdVar67 + 3;
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_data[lVar80] = (double)uVar10;
          lVar80 = lVar80 + 1;
        } while (lVar80 != 3);
        lVar68 = lVar68 + 1;
        pdVar58 = pdVar58 + 1;
        local_b00.
        super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
        m_data = local_b00.
                 super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                 .m_data + 0x18;
      } while (lVar68 != 3);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)local_380;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = (long)&local_1080;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)local_12c0._0_8_;
      local_d30 = pdVar61;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar81].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1340;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      lVar68 = 0;
      pdVar61 = (pCVar76->super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>).
                m_storage.m_data.array + lVar81 * 6 + 3;
      local_d38 = lVar69 + 3;
      uVar87 = -((uint)((ulong)pdVar61 >> 3) & 0x1fffffff) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078bd63:
          memcpy((void *)((long)&pvVar75[lVar68].m_value + uVar83),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar68 + lVar54 + 0x1340),uVar79);
        }
        else {
          memcpy(local_1350 + lVar68,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar68),local_f40._0_8_);
          if (uVar87 < 3) goto LAB_0078bd63;
        }
        lVar68 = lVar68 + 0x18;
      } while (lVar68 != 0x48);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           *(double *)(local_1250._0_8_ + 8 + lVar65);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 8);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)local_12c0._0_8_;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x10);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x18);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x20);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x28);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x30);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x38);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_12c0._0_8_ + 0x40);
      local_1298._0_8_ = &local_1340;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = local_d30 + 0x48;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startRow.m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_outerStride = 0x18;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.m_xpr =
           pCVar76;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startCol.m_value = lVar69;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                (&local_b00,(Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1298);
      if (((undefined1 *)
           local_b00.
           super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
           m_rows.m_value != (undefined1 *)0x3) ||
         ((Matrix<double,_3,_3,_1,_3,_3> *)
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_cols.m_value != (Matrix<double,_3,_3,_1,_3,_3> *)0x3)) goto LAB_0078f0f9;
      lVar69 = 0;
      pdVar58 = (double *)local_1298._0_8_;
      do {
        lVar68 = 0;
        pdVar67 = pdVar58;
        do {
          uVar10 = *pdVar67;
          pdVar67 = pdVar67 + 3;
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_data[lVar68] = (double)uVar10;
          lVar68 = lVar68 + 1;
        } while (lVar68 != 3);
        lVar69 = lVar69 + 1;
        pdVar58 = pdVar58 + 1;
        local_b00.
        super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
        m_data = local_b00.
                 super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                 .m_data + 0x18;
      } while (lVar69 != 3);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)local_680;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = (long)&local_1080;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)local_12c0._0_8_;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar81].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1340;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      lVar69 = 0;
      iVar72 = (int)pdVar61;
      uVar87 = -(iVar72 + 0x240U >> 3) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078bf8b:
          memcpy(local_1390 + lVar69,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69 + lVar54 + 0x1340),uVar79);
        }
        else {
          memcpy(pdVar77 + lVar69,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69),local_f40._0_8_);
          if (uVar87 < 3) goto LAB_0078bf8b;
        }
        lVar69 = lVar69 + 0x18;
      } while (lVar69 != 0x48);
      local_13e0.
      super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols
      .m_value = 0;
      pdStack_1120 = (double *)0x0;
      local_13e0.
      super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data
           = (double *)0x0;
      local_13e0.
      super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows
      .m_value = 0;
      local_1130 = ZEXT816(0);
      InterpDeriv(local_d60,(ChMatrixNM<double,_4,_2> *)local_1250._0_8_,
                  (ChVector<double> *)&local_13e0,(ChVector<double> *)local_1130);
      auVar97 = _local_1298;
      local_1390 = (*local_d68)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + (long)local_1208->m_data + lVar73 * 4;
      local_1298._8_8_ = &local_1200;
      local_1298._0_8_ = local_12c0._0_8_;
      pMStack_1288 = &local_1080;
      LStack_1280.m_matrix = (non_const_type)local_12c0._0_8_;
      _auStack_1270 = auVar97._40_24_;
      pdStack_1278 = local_1390;
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)&local_b00,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1298,(assign_op<double,_double> *)local_e88);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_rows.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_data;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_cols.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_xpr;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startRow.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startCol.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_outerStride;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           (double)uStack_ac8;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_ac0;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar81].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1340;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      lVar69 = 0;
      uVar87 = -(iVar72 + 0x480U >> 3) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078c127:
          memcpy((void *)(lVar4 + lVar69 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69 + lVar54 + 0x1340),uVar79);
        }
        else {
          memcpy((void *)(local_c80._0_8_ + lVar69 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69),local_f40._0_8_);
          if (uVar87 < 3) goto LAB_0078c127;
        }
        auVar97 = _local_1298;
        lVar69 = lVar69 + 0x18;
      } while (lVar69 != 0x48);
      pdVar61 = (*local_d70)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + (long)local_1208->m_data + lVar73 * 4;
      local_1298._8_8_ = (RhsNested)local_bc0;
      local_1298._0_8_ = local_12c0._0_8_;
      pMStack_1288 = &local_1080;
      LStack_1280.m_matrix = (non_const_type)local_12c0._0_8_;
      _auStack_1270 = auVar97._40_24_;
      pdStack_1278 = pdVar61;
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)&local_b00,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1298,(assign_op<double,_double> *)local_e88);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_rows.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_data;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_cols.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_xpr;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startRow.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startCol.m_value;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_outerStride;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           (double)uStack_ac8;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_ac0;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar81].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1340;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      lVar73 = local_d40;
      lVar69 = 0;
      uVar87 = -(iVar72 + 0x6c0U >> 3) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078c278:
          memcpy((void *)(lVar73 + lVar69 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69 + lVar54 + 0x1340),uVar79);
        }
        else {
          memcpy(pdVar60 + lVar69,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69),local_f40._0_8_);
          if (uVar87 < 3) goto LAB_0078c278;
        }
        lVar69 = lVar69 + 0x18;
      } while (lVar69 != 0x48);
      lVar73 = 0;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           *(double *)(local_1250._0_8_ + lVar65);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           0.0;
      pdVar58 = (local_1210->super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>).
                m_storage.m_data.array + lVar81 * 6;
      uVar87 = -((uint)((ulong)pdVar58 >> 3) & 0x1fffffff) & 7;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      do {
        if (uVar87 == 0) {
LAB_0078c35b:
          memcpy((void *)(lVar66 + lVar73 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73 + (uVar71 - 0x1340) + 0x1340),uVar88
                );
        }
        else {
          memcpy((void *)(local_c40._0_8_ + lVar73 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73),local_1380._0_8_);
          if (uVar87 < 3) goto LAB_0078c35b;
        }
        lVar73 = lVar73 + 0x18;
      } while (lVar73 != 0x48);
      lVar73 = 0;
      uVar87 = -((int)pdVar58 + 0x240U >> 3) & 7;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           *(double *)(local_1250._0_8_ + 8 + lVar65);
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           0.0;
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      do {
        if (uVar87 == 0) {
LAB_0078c438:
          memcpy(&(local_12b0->
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                  ).m_data + lVar73,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73 + (uVar71 - 0x1340) + 0x1340),uVar88
                );
        }
        else {
          memcpy((void *)(local_12d0._0_8_ + lVar73 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73),local_1380._0_8_);
          if (uVar87 < 3) goto LAB_0078c438;
        }
        lVar73 = lVar73 + 0x18;
      } while (lVar73 != 0x48);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar81].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = local_1390;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      lVar73 = 0;
      iVar72 = (int)local_1210 + (int)local_d38 * 8;
      uVar87 = -(iVar72 + 0x480U >> 3) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078c4fa:
          memcpy((void *)(local_1240._0_8_ + lVar73 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73 + lVar54 + 0x1340),uVar79);
        }
        else {
          memcpy((void *)(local_c00._0_8_ + lVar73 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73),local_f40._0_8_);
          if (uVar87 < 3) goto LAB_0078c4fa;
        }
        lVar73 = lVar73 + 0x18;
      } while (lVar73 != 0x48);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar81].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = pdVar61;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      lVar73 = 0;
      uVar87 = -(iVar72 + 0x6c0U >> 3) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078c5a3:
          memcpy((void *)(local_1230._0_8_ + lVar73 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73 + lVar54 + 0x1340),uVar79);
        }
        else {
          memcpy((void *)(local_1370._0_8_ + lVar73 * 8),
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73),local_f40._0_8_);
          if (uVar87 < 3) goto LAB_0078c5a3;
        }
        lVar73 = lVar73 + 0x18;
      } while (lVar73 != 0x48);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1080;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar81].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      lVar73 = 0;
      uVar87 = -(iVar72 + 0x900U >> 3) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078c64b:
          memcpy(local_1220 + lVar73 * 8,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73 + lVar54 + 0x1340),uVar79);
        }
        else {
          memcpy((local_1360->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).
                 m_storage.m_data.array + lVar73,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar73),local_f40._0_8_);
          if (uVar87 < 3) goto LAB_0078c64b;
        }
        lVar73 = lVar73 + 0x18;
      } while (lVar73 != 0x48);
      local_1350 = local_1350 + 6;
      local_c80._0_8_ = local_c80._0_8_ + 0x30;
      local_c40._0_8_ = local_c40._0_8_ + 0x30;
      local_12d0._0_8_ = local_12d0._0_8_ + 0x30;
      local_c00._0_8_ = local_c00._0_8_ + 0x30;
      local_1370._0_8_ = local_1370._0_8_ + 0x30;
      local_1360 = (ChMatrixNM<double,_4,_2> *)
                   ((local_1360->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).
                    m_storage.m_data.array + 6);
      lVar81 = lVar81 + 1;
      bVar56 = (char)local_1088 + 2;
      pdVar77 = pdVar77 + 6;
      pdVar60 = pdVar60 + 6;
      lVar69 = local_d28 + -6;
    } while (lVar81 != 4);
    pvVar75 = local_f48 + 0x120;
    pdVar64 = local_f50 + 0x120;
    pdVar67 = local_f58 + 0x120;
    pdVar60 = local_d78 + 0x120;
    lVar73 = local_d80 + 1;
    pCVar85 = local_f80 + 1;
    pdVar77 = local_f60 + 0x168;
    pdVar61 = local_f68 + 0x168;
    pdVar58 = local_f70 + 0x168;
    pCVar84 = local_f78 + 0x2d;
  } while (lVar73 != 4);
  local_dd0.m_data[2] = 0.0;
  local_dd0.m_data[0] = 0.0;
  local_dd0.m_data[1] = 0.0;
  local_df0.m_data[2] = 0.0;
  local_df0.m_data[0] = 0.0;
  local_df0.m_data[1] = 0.0;
  local_1208 = this->eps_tilde_1_0_A;
  local_1210 = (ChMatrixNM<double,_15,_24> *)this->eps_tilde_2_A;
  local_1088 = this->eps_tilde_2_0_A;
  lVar73 = 0;
  do {
    pvVar75 = (variable_if_dynamic<long,__1> *)&local_b00;
    memset(pvVar75,0,0x480);
    local_1360 = this->L_alpha_beta_A + lVar73;
    InterpDeriv(local_f88,local_1360,&local_dd0,&local_df0);
    auVar97 = _local_bc0;
    auVar144._8_8_ = local_dd0.m_data[1];
    auVar144._0_8_ = local_dd0.m_data[1];
    auVar48._8_8_ = local_dd0.m_data[1];
    auVar48._0_8_ = local_dd0.m_data[0];
    auVar123._8_8_ = local_dd0.m_data[2];
    auVar123._0_8_ = local_dd0.m_data[2];
    auVar135._8_8_ = local_df0.m_data[2];
    auVar135._0_8_ = local_df0.m_data[2];
    puVar82 = local_8c0;
    uVar88 = 0;
    local_1250._0_8_ = lVar73 * 9;
    pMVar5 = &this->T_A[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>;
    auVar149._0_8_ =
         local_dd0.m_data[1] *
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[3];
    auVar149._8_8_ =
         local_dd0.m_data[1] *
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[4];
    local_1370._0_8_ = pMVar5;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[2];
    auVar146._8_8_ = 0;
    auVar146._0_8_ =
         local_dd0.m_data[1] *
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[5];
    auVar90 = vfmadd231sd_fma(auVar146,auVar48,auVar11);
    auVar39._8_8_ = local_dd0.m_data[0];
    auVar39._0_8_ = local_dd0.m_data[0];
    auVar91 = vfmadd231pd_avx512vl
                        (auVar149,*(undefined1 (*) [16])
                                   (pMVar5->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                   m_storage.m_data.array,auVar39);
    dVar107 = local_1088[lVar73].m_data[2];
    auVar92 = *(undefined1 (*) [16])local_1088[lVar73].m_data;
    lVar69 = 0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[8];
    auVar93 = vfmadd231sd_fma(auVar90,auVar123,auVar12);
    auVar90 = vfmadd231pd_fma(auVar91,auVar123,
                              *(undefined1 (*) [16])
                               ((pMVar5->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                m_storage.m_data.array + 6));
    auVar90 = vsubpd_avx(auVar90,*(undefined1 (*) [16])local_1208[lVar73].m_data);
    dVar9 = local_1208[lVar73].m_data[2];
    auVar150._0_8_ = -local_dd0.m_data[2];
    auVar150._8_8_ = -local_dd0.m_data[2];
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar150);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)vmovlpd_avx(auVar123);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    *(undefined1 (*) [16])this->eps_tilde_1_A[lVar73].m_data = auVar90;
    this->eps_tilde_1_A[lVar73].m_data[2] = auVar93._0_8_ - dVar9;
    auVar147._8_8_ = local_df0.m_data[1];
    auVar147._0_8_ = local_df0.m_data[1];
    auVar47._8_8_ = local_df0.m_data[1];
    auVar47._0_8_ = local_df0.m_data[0];
    auVar157._0_8_ =
         local_df0.m_data[1] *
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[3];
    auVar157._8_8_ =
         local_df0.m_data[1] *
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[4];
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[2];
    auVar151._8_8_ = 0;
    auVar151._0_8_ =
         local_df0.m_data[1] *
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[5];
    auVar90 = vfmadd231sd_fma(auVar151,auVar47,auVar13);
    auVar40._8_8_ = local_df0.m_data[0];
    auVar40._0_8_ = local_df0.m_data[0];
    auVar91 = vfmadd231pd_avx512vl
                        (auVar157,*(undefined1 (*) [16])
                                   (pMVar5->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                   m_storage.m_data.array,auVar40);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
         array[8];
    auVar93 = vfmadd231sd_fma(auVar90,auVar135,auVar14);
    auVar90 = vfmadd231pd_fma(auVar91,auVar135,
                              *(undefined1 (*) [16])
                               ((pMVar5->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                m_storage.m_data.array + 6));
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = (double)vmovlpd_avx(auVar144);
    auVar92 = vsubpd_avx(auVar90,auVar92);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = -local_dd0.m_data[0];
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = -local_dd0.m_data[1];
    auVar140._0_8_ = -local_df0.m_data[2];
    auVar140._8_8_ = -local_df0.m_data[2];
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = (double)vmovlpd_avx(auVar48);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    uVar10 = vmovlpd_avx(auVar140);
    auVar52._8_48_ = stack0xfffffffffffff450;
    auVar52._0_8_ = uVar10;
    local_bc0 = auVar52._0_24_ << 0x40;
    dStack_ba8 = (double)vmovlpd_avx(auVar135);
    _adStack_b98 = auVar97._40_24_;
    lStack_ba0 = 0;
    *(undefined1 (*) [16])
     ((local_1210->super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>).m_storage.
      m_data.array + lVar73 * 3) = auVar92;
    (local_1210->super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>).m_storage.m_data.
    array[lVar73 * 3 + 2] = auVar93._0_8_ - dVar107;
    uVar10 = vmovlpd_avx(auVar147);
    local_bc0._16_8_ = uVar10;
    puVar70 = local_8a8;
    ppMVar59 = &local_b00.
                super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                .m_xpr;
    adStack_b98[0] = -local_df0.m_data[0];
    adStack_b98[1] = -local_df0.m_data[1];
    lStack_b88 = vmovlpd_avx(auVar47);
    auVar98._56_8_ = 0;
    auVar98._0_56_ = local_b80._8_56_;
    local_b80 = auVar98 << 0x40;
    bVar56 = 4;
    do {
      auVar92 = local_1380;
      lVar81 = 3;
      local_c00[0] = bVar56;
      local_c80._0_8_ = ppMVar59;
      local_12d0._0_8_ = puVar70;
      local_c40._0_8_ = puVar82;
      uVar87 = (bVar56 & 7) + 1;
      if (2 < uVar87) {
        uVar87 = 3;
      }
      uVar83 = (ulong)(uVar87 << 3);
      uVar71 = 3;
      if (uVar88 < 3) {
        uVar71 = uVar88;
      }
      uVar87 = (int)lVar69 * 2;
      uVar71 = (ulong)(uint)((int)uVar71 << 3);
      uVar10 = local_1250._0_8_;
      local_1230._0_8_ = uVar83 + (long)ppMVar59;
      local_f40._0_8_ =
           (long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           + uVar83;
      uVar63 = uVar87 + 5 & 7;
      if (2 < uVar63) {
        uVar63 = 3;
      }
      local_1380._4_4_ = 0;
      local_1380._0_4_ = uVar63 * 8;
      local_1380._8_8_ = auVar92._8_8_;
      uVar86 = uVar63;
      if (uVar63 < 3) {
        uVar86 = 2;
      }
      uVar87 = uVar87 & 6;
      uVar79 = (ulong)((uVar86 - uVar63) * 8 + 8);
      if (2 < uVar87) {
        uVar87 = 3;
      }
      local_1220 = puVar82 + uVar71;
      uVar63 = uVar87;
      if (uVar87 < 3) {
        uVar63 = 2;
      }
      __n = (ulong)((uVar63 - uVar87) * 8 + 8);
      local_1240._0_8_ =
           (long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           + uVar71;
      local_1350 = pvVar75;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = (double)(*(code *)(&LI)[lVar69])(&xi_A + lVar73 * 2);
      auVar97 = _local_1298;
      pdVar60 = this->Phi_Delta_A[0][lVar69].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + uVar10 * 4;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar60;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [1] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar60[1];
      local_1390 = (double *)(lVar69 * 0x10);
      pdVar60 = this->Phi_Delta_A[0][lVar69].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + uVar10 * 4 + 2;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [2] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar60;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [3] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar60[1];
      pdVar60 = this->Phi_Delta_A[0][lVar69].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + uVar10 * 4 + 4;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [4] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar60;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [5] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar60[1];
      pdVar60 = this->Phi_Delta_A[0][lVar69].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + uVar10 * 4 + 6;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [6] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * *pdVar60;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [7] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] * pdVar60[1];
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] *
            this->Phi_Delta_A[0][lVar69].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [uVar10 * 4 + 8];
      pdVar60 = (double *)&local_1340;
      local_1298._0_8_ = local_1370._0_8_;
      auVar98 = _local_1298;
      _LStack_1280 = auVar97._24_40_;
      local_1298 = auVar98._0_16_;
      pMStack_1288 = (RhsNested)
                     (local_1360->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).
                     m_storage.m_data.array[lVar69 * 2];
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)pdVar60,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)local_1298);
      local_12c0._0_8_ = lVar69;
      local_12b0 = &local_b00.
                    super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   + lVar69 * 2;
      uVar63 = -((uint)((ulong)local_12b0 >> 3) & 0x1fffffff) & 6;
      pvVar75 = local_1350;
      do {
        if ((uVar63 == 0) || (memcpy(pvVar75,pdVar60,(ulong)(uVar87 * 8)), uVar63 < 3)) {
          memcpy((void *)((long)&pvVar75->m_value + uVar71),(void *)((long)pdVar60 + uVar71),__n);
        }
        auVar97 = _local_1298;
        pvVar75 = pvVar75 + 0x18;
        pdVar60 = pdVar60 + 3;
        lVar81 = lVar81 + -1;
      } while (lVar81 != 0);
      uVar10 = local_1370._0_8_;
      local_1298._8_8_ = &local_1200;
      local_1298._0_8_ = local_1370._0_8_;
      _LStack_1280 = auVar97._24_40_;
      pMStack_1288 = &local_1080;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)&local_1340.super_Matrix<double,_3,_3,_1,_3,_3>,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1298);
      local_1298._8_8_ =
           (RhsNested)
           (*(long *)((long)&(((this->m_nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + (long)local_1390) + 0x58);
      local_1298._0_8_ = &local_1340.super_Matrix<double,_3,_3,_1,_3,_3>;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)&local_1340.super_Matrix<double,_3,_3,_1,_3,_3>,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1298);
      pvVar75 = local_1350;
      lVar69 = 0;
      uVar63 = -((int)local_12b0 + 0x18U >> 3) & 7;
      do {
        if (uVar63 == 0) {
LAB_0078cd5f:
          memcpy((void *)(local_1230._0_8_ + lVar69 * 8),(void *)(local_f40._0_8_ + lVar69),uVar79);
        }
        else {
          memcpy(pvVar75 + lVar69 + 3,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69),local_1380._0_8_);
          if (uVar63 < 3) goto LAB_0078cd5f;
        }
        auVar97 = _local_1298;
        lVar69 = lVar69 + 0x18;
      } while (lVar69 != 0x48);
      local_1298._0_8_ = uVar10;
      auVar98 = _local_1298;
      _LStack_1280 = auVar97._24_40_;
      local_1298 = auVar98._0_16_;
      pMStack_1288 = *(RhsNested *)
                      ((long)((local_1360->
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).
                              m_storage.m_data.array + 1) + (long)local_1390);
      ChMatrix33<double>::operator=
                (&local_1340,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)local_1298);
      lVar69 = 0;
      uVar63 = -((int)local_12b0 + 0x240U >> 3) & 7;
      do {
        if ((uVar63 == 0) ||
           (memcpy(pvVar75 + lVar69 + 0x48,
                   (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array + lVar69),(ulong)(uVar87 * 8)), uVar63 < 3)
           ) {
          memcpy(local_1220 + lVar69 * 8,(void *)(local_1240._0_8_ + lVar69),__n);
        }
        auVar97 = _local_1298;
        lVar69 = lVar69 + 0x18;
      } while (lVar69 != 0x48);
      local_1298._8_8_ = (RhsNested)local_bc0;
      _LStack_1280 = auVar97._24_40_;
      pMStack_1288 = &local_1080;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)&local_1340.super_Matrix<double,_3,_3,_1,_3,_3>,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1298);
      local_1298._8_8_ =
           (RhsNested)
           (*(long *)((long)&(((this->m_nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + (long)local_1390) + 0x58);
      local_1298._0_8_ = &local_1340.super_Matrix<double,_3,_3,_1,_3,_3>;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)&local_1340.super_Matrix<double,_3,_3,_1,_3,_3>,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1298);
      uVar10 = local_12c0._0_8_;
      lVar69 = 0;
      uVar87 = -((int)local_12b0 + 600U >> 3) & 7;
      do {
        if (uVar87 == 0) {
LAB_0078cef1:
          memcpy(puVar70 + lVar69 * 8 + uVar83,(void *)(local_f40._0_8_ + lVar69),uVar79);
        }
        else {
          memcpy(pvVar75 + lVar69 + 0x4b,
                 (void *)((long)local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar69),local_1380._0_8_);
          if (uVar87 < 3) goto LAB_0078cef1;
        }
        lVar69 = lVar69 + 0x18;
      } while (lVar69 != 0x48);
      lVar69 = uVar10 + 1;
      pvVar75 = pvVar75 + 6;
      uVar88 = uVar88 + 2;
      ppMVar59 = (XprTypeNested *)(local_c80._0_8_ + 0x30);
      bVar56 = local_c00[0] + 2;
      puVar82 = (undefined1 *)(local_c40._0_8_ + 0x30);
      puVar70 = (undefined1 *)(local_12d0._0_8_ + 0x30);
    } while (lVar69 != 4);
    lVar69 = lVar73 * 0xc0;
    lVar81 = lVar73 + 1;
    local_380[lVar73 * 0x18] = local_980;
    local_380[lVar73 * 0x18 + 1] = dStack_978;
    local_380[lVar73 * 0x18 + 2] = dStack_970;
    auStack_358[lVar73 * 0x18 + -2] = uStack_968;
    auStack_358[lVar73 * 0x18 + -1] = uStack_960;
    auStack_358[lVar73 * 0x18] = uStack_958;
    auStack_358[lVar73 * 0x18 + 1] = uStack_950;
    auStack_358[lVar73 * 0x18 + 2] = uStack_948;
    *(undefined8 *)(auStack_338 + lVar69 + -8) = local_940;
    *(undefined8 *)(auStack_338 + lVar69) = uStack_938;
    *(undefined8 *)(auStack_338 + lVar69 + 8) = uStack_930;
    *(undefined8 *)(auStack_338 + lVar69 + 0x10) = uStack_928;
    *(undefined8 *)(auStack_338 + lVar69 + 0x18) = uStack_920;
    *(undefined8 *)(local_300 + lVar69 + -0x18) = uStack_918;
    *(undefined8 *)(local_300 + lVar69 + -0x10) = uStack_910;
    *(undefined8 *)(local_300 + lVar69 + -8) = uStack_908;
    *(undefined8 *)(local_300 + lVar69) = local_900;
    *(undefined8 *)(local_300 + lVar69 + 8) = uStack_8f8;
    *(undefined8 *)(local_300 + lVar69 + 0x10) = uStack_8f0;
    *(undefined8 *)(local_300 + lVar69 + 0x18) = uStack_8e8;
    *(undefined8 *)(local_300 + lVar69 + 0x20) = uStack_8e0;
    *(undefined8 *)(local_2c0 + lVar69 + -0x18) = uStack_8d8;
    *(undefined8 *)(local_2c0 + lVar69 + -0x10) = uStack_8d0;
    *(undefined8 *)(local_2c0 + lVar69 + -8) = uStack_8c8;
    local_680[lVar73 * 0x18] = local_740;
    local_680[lVar73 * 0x18 + 1] = dStack_738;
    local_680[lVar73 * 0x18 + 2] = dStack_730;
    auStack_658[lVar73 * 0x18 + -2] = uStack_728;
    auStack_658[lVar73 * 0x18 + -1] = uStack_720;
    auStack_658[lVar73 * 0x18] = uStack_718;
    auStack_658[lVar73 * 0x18 + 1] = uStack_710;
    auStack_658[lVar73 * 0x18 + 2] = uStack_708;
    *(undefined8 *)(auStack_638 + lVar69 + -8) = local_700;
    *(undefined8 *)(auStack_638 + lVar69) = uStack_6f8;
    *(undefined8 *)(auStack_638 + lVar69 + 8) = uStack_6f0;
    *(undefined8 *)(auStack_638 + lVar69 + 0x10) = uStack_6e8;
    *(undefined8 *)(auStack_638 + lVar69 + 0x18) = uStack_6e0;
    *(undefined8 *)(local_600 + lVar69 + -0x18) = uStack_6d8;
    *(undefined8 *)(local_600 + lVar69 + -0x10) = uStack_6d0;
    *(undefined8 *)(local_600 + lVar69 + -8) = uStack_6c8;
    *(undefined8 *)(local_600 + lVar69) = local_6c0;
    *(undefined8 *)(local_600 + lVar69 + 8) = uStack_6b8;
    *(undefined8 *)(local_600 + lVar69 + 0x10) = uStack_6b0;
    *(undefined8 *)(local_600 + lVar69 + 0x18) = uStack_6a8;
    *(undefined8 *)(local_600 + lVar69 + 0x20) = uStack_6a0;
    *(undefined8 *)(local_5c0 + lVar69 + -0x18) = uStack_698;
    *(undefined8 *)(local_5c0 + lVar69 + -0x10) = uStack_690;
    *(undefined8 *)(local_5c0 + lVar69 + -8) = uStack_688;
    lVar73 = lVar81;
  } while (lVar81 != 4);
  auVar104._8_8_ = local_380[1];
  auVar104._0_8_ = local_380[0];
  auVar104._16_8_ = local_380[2];
  auVar104._24_8_ = local_380[3];
  auVar104._32_8_ = uStack_360;
  auVar104._40_8_ = auStack_358[0];
  auVar104._48_8_ = auStack_358[1];
  auVar104._56_8_ = auStack_358[2];
  auVar105._8_56_ = auStack_338;
  auVar105._0_8_ = auStack_358[3];
  auVar103._8_8_ = local_680[1];
  auVar103._0_8_ = local_680[0];
  auVar103._16_8_ = local_680[2];
  auVar103._24_8_ = local_680[3];
  auVar103._32_8_ = uStack_660;
  auVar103._40_8_ = auStack_658[0];
  auVar103._48_8_ = auStack_658[1];
  auVar103._56_8_ = auStack_658[2];
  auVar167._8_56_ = auStack_638;
  auVar167._0_8_ = auStack_658[3];
  lVar73 = 18000;
  puVar78 = &DAT_00b6ac48;
  pdVar60 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0x88;
  do {
    auVar97 = _local_bc0;
    uVar88 = *puVar78;
    puVar1 = puVar78 + -1;
    puVar78 = puVar78 + 2;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar88;
    auVar92 = vaddsd_avx512f(auVar168,ZEXT816(0x3ff0000000000000));
    auVar169._8_8_ = 0;
    auVar169._0_8_ = *puVar1;
    auVar90 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar169);
    auVar93 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar168);
    auVar91 = vaddsd_avx512f(auVar169,ZEXT816(0x3ff0000000000000));
    auVar92 = vmulsd_avx512f(auVar92,ZEXT816(0x3fe0000000000000));
    auVar90 = vmulsd_avx512f(auVar90,ZEXT816(0x3fe0000000000000));
    auVar93 = vmulsd_avx512f(auVar93,ZEXT816(0x3fe0000000000000));
    auVar91 = vmulsd_avx512f(auVar91,ZEXT816(0x3fe0000000000000));
    vmovsd_avx512f(auVar92);
    vmovsd_avx512f(auVar93);
    vmovsd_avx512f(auVar90);
    uVar10 = local_bc0._8_8_;
    local_bc0 = ZEXT824((ulong)local_bc0._8_8_) << 0x40;
    vmovsd_avx512f(auVar91);
    dStack_ba8 = auVar97._24_8_;
    _lStack_ba0 = auVar97._32_32_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = this->eps_tilde_1_A[2].m_data[2];
    auVar93 = vmulsd_avx512f(auVar93,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = this->eps_tilde_1_A[0].m_data[2];
    auVar92 = vfmadd231sd_avx512f(auVar93,auVar92,auVar16);
    puVar8 = (undefined8 *)
             ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                     _vptr_ChElementBase + lVar73);
    vmovsd_avx512f(auVar92);
    *puVar8 = *puVar8;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->eps_tilde_2_A[3].m_data[2];
    auVar92 = vmulsd_avx512f(auVar91,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = this->eps_tilde_2_A[1].m_data[2];
    auVar92 = vfmadd231sd_avx512f(auVar92,auVar90,auVar18);
    puVar8 = (undefined8 *)
             ((long)(this->m_MassMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar73 + -0x60);
    vmovsd_avx512f(auVar92);
    *puVar8 = *puVar8;
    lVar73 = lVar73 + 0x18;
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar97 = vbroadcastsd_avx512f(auVar19);
    auVar98 = vbroadcastsd_avx512f(ZEXT816(0));
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar99 = vbroadcastsd_avx512f(auVar20);
    auVar100 = vbroadcastsd_avx512f(ZEXT816(0));
    auVar101 = vmulpd_avx512f(local_300,auVar97);
    auVar102 = vmulpd_avx512f(auVar97,auVar105);
    auVar97 = vmulpd_avx512f(auVar97,auVar104);
    auVar101 = vfmadd231pd_avx512f(auVar101,auVar98,local_240);
    auVar102 = vfmadd231pd_avx512f(auVar102,auVar98,local_280);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_2c0,auVar98);
    auVar98 = vfmadd231pd_avx512f(auVar101,auVar99,local_180);
    auVar101 = vfmadd231pd_avx512f(auVar102,auVar99,local_1c0);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_200,auVar99);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_140,auVar100);
    auVar98 = vfmadd231pd_avx512f(auVar98,auVar100,local_c0);
    auVar99 = vfmadd231pd_avx512f(auVar101,auVar100,local_100);
    *(undefined1 (*) [64])(pdVar60 + -0x58) = auVar97;
    *(undefined1 (*) [64])(pdVar60 + -0x50) = auVar99;
    *(undefined1 (*) [64])(pdVar60 + -0x48) = auVar98;
    auVar97 = vbroadcastsd_avx512f(ZEXT816(0));
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar10;
    auVar98 = vbroadcastsd_avx512f(auVar21);
    auVar99 = vbroadcastsd_avx512f(ZEXT816(0));
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dStack_ba8;
    auVar100 = vbroadcastsd_avx512f(auVar22);
    auVar101 = vmulpd_avx512f(local_600,auVar97);
    auVar102 = vmulpd_avx512f(auVar97,auVar167);
    auVar97 = vmulpd_avx512f(auVar97,auVar103);
    auVar101 = vfmadd231pd_avx512f(auVar101,auVar98,local_540);
    auVar102 = vfmadd231pd_avx512f(auVar102,auVar98,local_580);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_5c0,auVar98);
    auVar98 = vfmadd231pd_avx512f(auVar101,auVar99,local_480);
    auVar101 = vfmadd231pd_avx512f(auVar102,auVar99,local_4c0);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_500,auVar99);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_440,auVar100);
    auVar98 = vfmadd231pd_avx512f(auVar98,auVar100,local_3c0);
    auVar99 = vfmadd231pd_avx512f(auVar101,auVar100,local_400);
    *(undefined1 (*) [64])(pdVar60 + -0x10) = auVar97;
    *(undefined1 (*) [64])(pdVar60 + -8) = auVar99;
    *(undefined1 (*) [64])pdVar60 = auVar98;
    pdVar60 = pdVar60 + 0x120;
  } while (lVar73 != 0x46b0);
  pCVar2 = &this->epsilon;
  pdVar60 = (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
            .m_data.array + 6;
  lVar73 = 0;
  pdVar77 = (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
            .m_data.array + 9;
  do {
    uVar88 = lVar73 * 0x60;
    local_1380._0_8_ = uVar88;
    uVar71 = (ulong)(-((int)uVar88 + 0x30U >> 3) & 6);
    if (2 < uVar71) {
      uVar71 = 3;
    }
    local_1230._0_8_ = uVar71;
    uVar87 = (uint)(uVar88 >> 3);
    uVar88 = (ulong)(5 - uVar87 & 5);
    if (2 < uVar88) {
      uVar88 = 3;
    }
    local_12b0 = (MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                  *)(ulong)(uVar87 & 4);
    local_1240._0_8_ = uVar88;
    if (2 < local_12b0) {
      local_12b0 = (MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                    *)0x3;
    }
    local_1220 = (undefined1 *)(lVar73 * 0x18);
    pCVar6 = local_f90 + lVar73;
    dVar107 = pCVar6->m_data[1];
    dVar9 = pCVar6->m_data[2];
    dVar37 = (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
             m_storage.m_data.array[3];
    (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array
    [0] = pCVar6->m_data[0];
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[1] = dVar107;
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[2] = dVar9;
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[3] = dVar37;
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[3] = local_f98[lVar73].m_data[0];
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[4] = local_f98[lVar73].m_data[1];
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[5] = local_f98[lVar73].m_data[2];
    pCVar6 = local_fa0 + lVar73;
    dVar107 = pCVar6->m_data[1];
    dVar9 = pCVar6->m_data[2];
    dVar37 = (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
             m_storage.m_data.array[9];
    *pdVar60 = pCVar6->m_data[0];
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[7] = dVar107;
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[8] = dVar9;
    (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
    array[9] = dVar37;
    auVar96._24_8_ = SUB328(*(undefined1 (*) [32])pdVar77,0x18);
    auVar96._0_24_ = *(undefined1 (*) [24])local_fa8[lVar73].m_data;
    *(undefined1 (*) [32])pdVar77 = auVar96;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)pCVar2;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)pCVar2;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_fe0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)((this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
                   m_storage.m_data.array + 3);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)pCVar2;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_1000,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 2.96439387504748e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)pdVar60;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)pCVar2;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_ea0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 4.44659081257122e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)pdVar77;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)pCVar2;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_ec0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    auVar92 = auVar167._0_16_;
    local_10b0 = 0.0;
    local_10d0 = 0.0;
    local_1010 = 0.0;
    local_ed0 = 0.0;
    local_cd0 = 0.0;
    local_cf0 = 0.0;
    local_d10 = 0.0;
    local_10c0 = ZEXT816(0);
    local_10e0 = ZEXT816(0);
    local_1020 = (blas_data_mapper<const_double,_long,_0,_0,_1>)ZEXT816(0);
    local_ee0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = (double *)0x0;
    local_ee0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 0;
    local_ce0 = 0.0;
    dStack_cd8 = 0.0;
    local_d00 = 0.0;
    dStack_cf8 = 0.0;
    local_d20 = 0.0;
    dStack_d18 = 0.0;
    pLVar62 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar107 = 0.0;
    if ((this->m_layers).
        super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
        ._M_impl.super__Vector_impl_data._M_finish == pLVar62) {
      local_f40._0_16_ = ZEXT816(0);
      local_1370 = ZEXT816(0);
      local_12d0 = ZEXT816(0);
      local_c80._0_16_ = ZEXT816(0);
      local_c00._0_16_ = ZEXT816(0);
      local_12c0 = ZEXT816(0);
      local_c40._0_16_ = ZEXT816(0);
      local_1250 = ZEXT816(0);
    }
    else {
      auVar148 = ZEXT816(0) << 0x40;
      lVar69 = 0;
      uVar88 = 0;
      do {
        plVar27 = *(long **)((long)&(pLVar62->m_material).
                                    super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar69);
        p_Var28 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(pLVar62->m_material).
                           super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar69);
        local_f40._8_8_ = 0;
        local_f40._0_8_ = dVar107;
        if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
            UNLOCK();
            pLVar62 = (this->m_layers).
                      super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
          }
        }
        pdVar29 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (**(code **)(*plVar27 + 0x10))
                  (pdVar29[uVar88],pdVar29[uVar88 + 1],
                   *(undefined8 *)((long)&pLVar62->m_theta + lVar69),plVar27,&local_ee0,&local_ce0,
                   &local_d00,&local_d20,&local_fe0,&local_1000,&local_ea0,&local_ec0,0,0);
        if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var28);
        }
        auVar92 = auVar167._0_16_;
        local_1430._0_8_ = auVar148._0_8_;
        local_1430._8_8_ = auVar148._8_8_;
        uVar88 = uVar88 + 1;
        lVar69 = lVar69 + 0x28;
        local_10c0._0_8_ =
             (double)local_ee0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data +
             (double)local_10c0._0_8_;
        local_10c0._8_8_ =
             (double)local_ee0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride +
             (double)local_10c0._8_8_;
        auVar148._0_8_ = (double)local_1430._0_8_ + local_d20;
        auVar148._8_8_ = (double)local_1430._8_8_ + dStack_d18;
        local_10b0 = local_ed0 + local_10b0;
        local_10e0._0_8_ = local_ce0 + (double)local_10e0._0_8_;
        local_10e0._8_8_ = dStack_cd8 + (double)local_10e0._8_8_;
        local_10d0 = local_cd0 + local_10d0;
        local_1020.m_data = (double *)(local_d00 + (double)local_1020.m_data);
        local_1020.m_stride = (long)(dStack_cf8 + (double)local_1020.m_stride);
        local_1010 = local_cf0 + local_1010;
        dVar107 = (double)local_f40._0_8_ + local_d10;
        pLVar62 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar88 < (ulong)(((long)(this->m_layers).
                                       super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar62 >>
                                3) * -0x3333333333333333));
      local_1370 = vshufpd_avx(auVar148,auVar148,1);
      auVar90 = vshufpd_avx((undefined1  [16])local_1020,(undefined1  [16])local_1020,1);
      local_f40._8_8_ = 0;
      local_f40._0_8_ = dVar107;
      local_c00._0_8_ = local_1020.m_data;
      local_c00._8_8_ = local_1020.m_stride;
      local_c40._0_16_ = local_10e0;
      local_c80._0_16_ = auVar90;
      local_12c0 = vshufpd_avx(local_10e0,local_10e0,1);
      local_1250 = vshufpd_avx(local_10c0,local_10c0,1);
      local_12d0 = auVar148;
    }
    auVar93 = local_10c0;
    auVar90 = local_12d0;
    uStack_1348 = 0;
    uStack_1358 = 0;
    dStack_1388 = 0.0;
    uVar10 = local_1380._0_8_;
    pvVar89 = (void *)((long)this->stress_i[0].
                             super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
                             m_storage.m_data.array + local_1380._0_8_);
    uVar88 = (ulong)(uint)((int)local_12b0 << 3);
    pPVar74 = &this->stress_i[lVar73].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
    ;
    iVar72 = (int)pPVar74;
    uVar87 = -((uint)((ulong)pPVar74 >> 3) & 0x1fffffff) & 7;
    local_1390 = (double *)local_1010;
    local_1360 = (ChMatrixNM<double,_4,_2> *)local_10b0;
    local_1350 = (variable_if_dynamic<long,__1> *)local_10d0;
    if ((uVar87 == 0) || (memcpy(pvVar89,local_10c0,uVar88), uVar87 < 3)) {
      memcpy((void *)((long)pvVar89 + uVar88),local_10c0 + uVar88,uVar88 ^ 0x18);
    }
    uVar88 = (ulong)(uint)(local_1240._0_4_ << 3);
    pvVar89 = (void *)((long)this->stress_i[0].
                             super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
                             m_storage.m_data.array + uVar10 + 0x18);
    uVar87 = -(iVar72 + 0x18U >> 3) & 7;
    if ((uVar87 == 0) || (memcpy(pvVar89,local_10e0,uVar88), uVar87 < 3)) {
      memcpy((void *)((long)pvVar89 + uVar88),local_10e0 + uVar88,uVar88 ^ 0x18);
    }
    uVar88 = (ulong)(uint)(local_1230._0_4_ << 3);
    pvVar89 = (void *)((long)this->stress_i[0].
                             super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
                             m_storage.m_data.array + uVar10 + 0x30);
    uVar87 = -(iVar72 + 0x30U >> 3) & 7;
    if (uVar87 == 0) {
LAB_0078d9fc:
      memcpy((void *)((long)pvVar89 + uVar88),(void *)((long)&local_1020.m_data + uVar88),
             uVar88 ^ 0x18);
    }
    else {
      memcpy(pvVar89,&local_1020,uVar88);
      if (uVar87 < 3) goto LAB_0078d9fc;
    }
    if ((-(iVar72 + 0x48U >> 3) & 7) != 0) {
      local_1430._0_8_ = auVar90._0_8_;
      local_1430._8_8_ = auVar90._8_8_;
      puVar8 = (undefined8 *)
               ((long)this->stress_i[0].
                      super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                      m_data.array + local_1380._0_8_ + 0x48);
      *puVar8 = local_1430._0_8_;
      puVar8[1] = local_1430._8_8_;
      puVar8 = (undefined8 *)
               ((long)this->stress_i[0].
                      super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                      m_data.array + local_1380._0_8_ + 0x58);
      vmovsd_avx512f(local_f40._0_16_);
      *puVar8 = *puVar8;
    }
    auVar45._8_8_ = uStack_1358;
    auVar45._0_8_ = local_1360;
    auVar46._8_8_ = uStack_1348;
    auVar46._0_8_ = local_1350;
    auVar44._8_8_ = dStack_1388;
    auVar44._0_8_ = local_1390;
    local_e88._8_16_ = vxorpd_avx512vl(auVar92,auVar92);
    auVar167 = ZEXT1664(local_e88._8_16_);
    puStack_1198 = local_1130;
    puStack_1188 = local_e88;
    dVar107 = local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
    ;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = dVar107;
    auVar124._8_8_ = 0;
    auVar124._0_8_ =
         local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar141._8_8_ = 0;
    auVar141._0_8_ =
         local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar136._8_8_ = 0;
    auVar136._0_8_ =
         local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar115._8_8_ = 0;
    auVar115._0_8_ =
         local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar145._8_8_ = 0;
    auVar145._0_8_ =
         local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar92 = vmovhpd_avx(auVar141,local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[4]);
    auVar90 = vmovhpd_avx(auVar115,local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[3]);
    auVar91 = vmovhpd_avx(auVar145,local_fb8[lVar73].super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[5]);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)((long)local_fb0->m_data + (long)local_1220 + 0x10);
    auVar97 = vbroadcastsd_avx512f(auVar23);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = local_e88._16_8_;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = local_e88._8_8_;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    auVar94 = vmulsd_avx512f(local_1250,auVar129);
    auVar94 = vfmadd231sd_fma(auVar94,auVar124,auVar93);
    auVar158._0_8_ = auVar93._0_8_;
    auVar158._8_8_ = auVar158._0_8_;
    local_1430._0_16_ = vfmadd231sd_avx512f(auVar94,auVar136,auVar45);
    auVar93 = vmulsd_avx512f(auVar129,local_12c0);
    auVar93 = vfmadd231sd_fma(auVar93,auVar124,local_c40._0_16_);
    auVar163._0_8_ = local_c40._0_8_;
    auVar163._8_8_ = auVar163._0_8_;
    local_1380 = vfmadd231sd_avx512f(auVar93,auVar136,auVar46);
    dVar9 = auVar92._0_8_;
    auVar165._0_8_ = (double)local_1370._0_8_ * dVar9;
    dVar37 = auVar92._8_8_;
    auVar165._8_8_ = (double)local_1370._0_8_ * dVar37;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = (double)local_c80._0_8_ * dVar107;
    auVar93 = vfmadd231sd_fma(auVar142,auVar124,local_c00._0_16_);
    auVar130._8_8_ = 0;
    auVar130._0_8_ = (double)local_1370._0_8_ * dVar107;
    auVar94 = vfmadd231sd_fma(auVar130,local_12d0,auVar124);
    auVar95 = vmulsd_avx512f(local_1430._0_16_,auVar97._0_16_);
    auVar166._0_8_ = local_12d0._0_8_;
    auVar166._8_8_ = auVar166._0_8_;
    auVar164._0_8_ = local_c00._0_8_;
    auVar164._8_8_ = auVar164._0_8_;
    auVar92 = vfmadd213pd_fma(auVar166,auVar90,auVar165);
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar95._0_8_;
    local_1230 = vfmadd231sd_avx512f(auVar93,auVar136,auVar44);
    local_1240 = vfmadd231sd_avx512f(auVar94,local_f40._0_16_,auVar136);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)((long)local_1090->m_data + (long)local_1220 + 0x10);
    auVar98 = vbroadcastsd_avx512f(auVar24);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0;
    uStack_13a8 = 0;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)0x0;
    auVar93 = vmulsd_avx512f(local_1380,auVar98._0_16_);
    local_1258 = auVar93._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)((long)local_fc0->m_data + (long)local_1220 + 0x10);
    auVar103 = vbroadcastsd_avx512f(auVar25);
    auStack_e60 = ZEXT824((ulong)local_1080.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array[5]);
    local_e88._24_8_ = 0;
    auVar93 = vmulsd_avx512f(local_1230,auVar103._0_16_);
    local_10f0 = auVar93._0_8_;
    auVar93 = vmovddup_avx512vl(local_1250);
    auVar153._0_8_ = auVar93._0_8_ * dVar9;
    auVar153._8_8_ = auVar93._8_8_ * dVar37;
    auVar93 = vfmadd213pd_fma(auVar158,auVar90,auVar153);
    auVar94 = vmovddup_avx512vl(local_12c0);
    auVar95 = vmovddup_avx512vl(auVar45);
    auVar154._0_8_ = auVar94._0_8_ * dVar9;
    auVar154._8_8_ = auVar94._8_8_ * dVar37;
    auVar95 = vfmadd213pd_avx512vl(auVar95,auVar91,auVar93);
    auVar93 = vfmadd213pd_fma(auVar163,auVar90,auVar154);
    auVar155._0_8_ = (double)local_c80._0_8_ * dVar9;
    auVar155._8_8_ = (double)local_c80._0_8_ * dVar37;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)((long)local_fc8->m_data + (long)local_1220 + 0x10);
    auVar104 = vbroadcastsd_avx512f(auVar26);
    vinsertf32x4_avx512f(ZEXT1664(auVar95),auVar95,1);
    auVar90 = vfmadd213pd_fma(auVar164,auVar90,auVar155);
    auStack_e18 = ZEXT824((ulong)local_1080.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array[5]);
    uStack_e28 = 0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = (double)&local_1340;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = (double)&local_1080;
    auVar105 = vpermt2pd_avx512f(_DAT_009b73c0,auVar97);
    puStack_11b8 = local_1298;
    pBStack_11a8 = &local_13e0;
    puStack_1178 = local_cc8;
    auVar94 = vmulsd_avx512f(local_1240,auVar104._0_16_);
    pdStack_1168 = &local_e40;
    local_c88 = auVar94._0_8_;
    auVar99 = vbroadcastsd_avx512f(local_1430._0_16_);
    auVar100 = vpermt2pd_avx512f(_DAT_009b7400,auVar99);
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
         vmulpd_avx512f(auVar100,auVar105);
    auVar94 = vmovddup_avx512vl(auVar46);
    auVar93 = vfmadd213pd_fma(auVar94,auVar91,auVar93);
    local_c40 = ZEXT1664(auVar93);
    auVar94 = vextractf32x4_avx512f
                        ((undefined1  [64])
                         local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array._0_64_,2);
    auVar94 = vfmadd231sd_avx512f(auVar94,auVar95,
                                  *(undefined1 (*) [16])((long)local_fb0->m_data + (long)local_1220)
                                 );
    vinsertf32x4_avx512f(local_c40,auVar93,1);
    auVar94 = vfmadd231sd_avx512f(auVar94,local_1430._0_16_,auVar97._0_16_);
    auVar97 = vpermt2pd_avx512f(_DAT_009b73c0,auVar98);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = auVar94._0_8_;
    auVar105 = vbroadcastsd_avx512f(local_1380);
    auVar100 = vpermt2pd_avx512f(_DAT_009b7400,auVar105);
    _local_1298 = vmulpd_avx512f(auVar100,auVar97);
    auVar94 = vmovddup_avx512vl(auVar44);
    auVar90 = vfmadd213pd_fma(auVar94,auVar91,auVar90);
    local_c00 = ZEXT1664(auVar90);
    auVar94 = vextractf32x4_avx512f(_local_1298,2);
    auVar94 = vfmadd231sd_fma(auVar94,auVar93,
                              *(undefined1 (*) [16])((long)local_1090->m_data + (long)local_1220));
    auVar97 = vpermt2pd_avx512f(_DAT_009b73c0,auVar103);
    auVar94 = vfmadd231sd_avx512f(auVar94,local_1380,auVar98._0_16_);
    auVar98 = vbroadcastsd_avx512f(local_1230);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         auVar94._0_8_;
    vinsertf32x4_avx512f(local_c00,auVar90,1);
    auVar100 = vpermt2pd_avx512f(_DAT_009b7400,auVar98);
    _local_1130 = vmulpd_avx512f(auVar100,auVar97);
    auVar94 = vextractf32x4_avx512f(_local_1130,2);
    auVar94 = vfmadd231sd_fma(auVar94,auVar90,
                              *(undefined1 (*) [16])((long)local_fc0->m_data + (long)local_1220));
    auVar97 = vpermt2pd_avx512f(_DAT_009b73c0,auVar104);
    auVar94 = vfmadd231sd_avx512f(auVar94,local_1230,auVar103._0_16_);
    local_e88._0_8_ = auVar94._0_8_;
    auVar94 = vmovddup_avx512vl(local_f40._0_16_);
    auVar92 = vfmadd213pd_fma(auVar94,auVar91,auVar92);
    local_f40._0_64_ = ZEXT1664(auVar92);
    auVar103 = vbroadcastsd_avx512f(local_1240);
    vinsertf32x4_avx512f(local_f40._0_64_,auVar92,1);
    auVar100 = vpermt2pd_avx512f(_DAT_009b7400,auVar103);
    local_cc8 = vmulpd_avx512f(auVar100,auVar97);
    auVar131._8_8_ = 0x8000000000000000;
    auVar131._0_8_ = 0x8000000000000000;
    auVar91 = vextractf32x4_avx512f(local_cc8,2);
    auVar92 = vfmadd231sd_fma(auVar91,auVar92,
                              *(undefined1 (*) [16])((long)local_fc8->m_data + (long)local_1220));
    local_12d0 = vxorpd_avx512vl(auVar95,auVar131);
    local_1220 = (undefined1 *)(auVar103._0_8_ ^ 0x8000000000000000);
    uStack_1218 = auVar103._8_8_ ^ 0x8000000000000000;
    local_1360 = (ChMatrixNM<double,_4,_2> *)(auVar105._0_8_ ^ 0x8000000000000000);
    uStack_1358 = auVar105._8_8_ ^ 0x8000000000000000;
    auVar92 = vfmadd231sd_avx512f(auVar92,local_1240,auVar104._0_16_);
    local_1370._8_8_ = auVar99._8_8_ ^ 0x8000000000000000;
    local_1370._0_8_ = auVar99._0_8_ ^ 0x8000000000000000;
    local_1350 = (variable_if_dynamic<long,__1> *)(auVar93._0_8_ ^ 0x8000000000000000);
    uStack_1348 = auVar93._8_8_ ^ 0x8000000000000000;
    local_12b0 = (MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                  *)(auVar98._0_8_ ^ 0x8000000000000000);
    uStack_12a8 = auVar98._8_8_ ^ 0x8000000000000000;
    local_1390 = (double *)(auVar90._0_8_ ^ 0x8000000000000000);
    dStack_1388 = -auVar90._8_8_;
    local_e40 = auVar92._0_8_;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array[1];
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array[5];
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = (long)local_13e0.
                    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>
                    .m_data;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = (long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array[5];
    local_13a0 = local_13e0.
                 super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>
                 .m_data;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[5];
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0];
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0];
    dStack_e68 = (double)local_e88._0_8_;
    local_e48 = (double)local_e88._0_8_;
    dStack_e38 = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[1];
    dStack_e30 = local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[5];
    dStack_e20 = local_e40;
    local_e00 = local_e40;
    local_c80 = ZEXT1664(auVar95);
    ChMatrix33<double>::operator=
              ((ChMatrix33<double> *)local_bc0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)&local_1200);
    auVar97 = _local_1130;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    auVar92 = vmovlps_avx(local_c80._0_16_,local_1370._0_8_);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         this->G_i[lVar73].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.
         m_storage.m_data.array + 0xb4;
    pPVar7 = &this->G_i[lVar73].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = auVar92._0_8_;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = auVar92._8_8_;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)local_1430._0_8_;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = (double)local_12d0._0_8_;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = (double)local_12d0._8_8_;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = (double)vmovlps_avx(local_c80._0_16_);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    auVar92 = vmovlps_avx(local_c40._0_16_,local_1360);
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_40_ =
         ZEXT2440(CONCAT816(local_1380._0_8_,auVar92)) << 0x40;
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)local_1350;
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)uStack_1348;
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         (double)vmovlps_avx(local_c40._0_16_);
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    auVar92 = vmovlps_avx(local_c00._0_16_,local_12b0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = auVar92._0_8_;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = auVar92._8_8_;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)local_1230._0_8_;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = (double)local_1390;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = dStack_1388;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = (double)vmovlps_avx(local_c00._0_16_);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    auVar90 = local_f40._0_16_;
    auVar92 = vmovlpd_avx(auVar90,local_1220);
    auVar41._8_8_ = 0x8000000000000000;
    auVar41._0_8_ = 0x8000000000000000;
    auStack_1270 = vxorpd_avx512vl(auVar90,auVar41);
    _local_1298 = ZEXT2440(CONCAT816(local_1240._0_8_,auVar92)) << 0x40;
    uStack_1260 = vmovlpd_avx(auVar90);
    local_1258 = 0;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = 0xc;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_1130._8_8_ = local_cc8;
    local_1130._0_8_ = local_e88;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0xf;
    pdStack_1120 = &local_e40;
    auStack_1110 = auVar97._32_32_;
    pBStack_1118 = &local_13e0;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    local_e88._0_8_ =
         local_13e0.
         super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
         m_data;
    local_cc8._0_8_ =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
          *)&local_1200;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_1130);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         this->G_i[lVar73].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.
         m_storage.m_data.array + 0xb7;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = 0xc;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0xf;
    local_cc8._0_8_ = &local_1340;
    local_1130._8_8_ = local_cc8;
    local_1130._0_8_ = local_e88;
    pdStack_1120 = &local_e40;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    local_e88._0_8_ =
         local_13e0.
         super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
         m_data;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_1130);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         this->G_i[lVar73].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.
         m_storage.m_data.array + 0xba;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = 0xc;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = 6;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0xf;
    local_cc8._0_8_ = &local_1080;
    local_1130._8_8_ = local_cc8;
    local_1130._0_8_ = local_e88;
    pdStack_1120 = &local_e40;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    local_e88._0_8_ =
         local_13e0.
         super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
         m_data;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_1130);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         this->G_i[lVar73].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.
         m_storage.m_data.array + 0xbd;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = 0xc;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = 9;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0xf;
    local_cc8._0_8_ = local_1298;
    local_1130._8_8_ = local_cc8;
    local_1130._0_8_ = local_e88;
    pdStack_1120 = &local_e40;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    local_e88._0_8_ =
         local_13e0.
         super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
         m_data;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_1130);
    local_1130._0_8_ = &local_1200;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         this->G_i[lVar73].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.
         m_storage.m_data.array + 0xc;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = 0;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = 0xc;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0xf;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    Eigen::internal::
    check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              (&local_13e0,(Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1130);
    if ((local_13e0.
         super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
         m_rows.m_value != 3) ||
       (local_13e0.
        super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
        m_cols.m_value != 3)) {
LAB_0078f118:
      __function = 
      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 15, 15, 1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 15, 15, 1>>]"
      ;
LAB_0078f10e:
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,__function);
    }
    lVar69 = 0;
    pdVar61 = (double *)local_1130._0_8_;
    do {
      lVar81 = 0;
      pdVar58 = pdVar61;
      do {
        dVar107 = *pdVar58;
        pdVar58 = pdVar58 + 3;
        local_13e0.
        super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
        m_data[lVar81] = dVar107;
        lVar81 = lVar81 + 1;
      } while (lVar81 != 3);
      lVar69 = lVar69 + 1;
      pdVar61 = pdVar61 + 1;
      local_13e0.
      super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data
           = local_13e0.
             super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>
             .m_data + 0xf;
    } while (lVar69 != 3);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         (pPVar7->m_storage).m_data.array + 0x39;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = 0xc;
    local_1130._0_8_ = &local_1340;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0xf;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    Eigen::internal::
    check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              (&local_13e0,(Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1130);
    auVar97 = _local_1130;
    if ((local_13e0.
         super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
         m_rows.m_value != 3) ||
       (local_13e0.
        super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
        m_cols.m_value != 3)) goto LAB_0078f118;
    lVar69 = 0;
    do {
      lVar81 = 0;
      pdVar61 = (double *)local_1130._0_8_;
      do {
        dVar107 = *pdVar61;
        pdVar61 = pdVar61 + 3;
        local_13e0.
        super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
        m_data[lVar81] = dVar107;
        lVar81 = lVar81 + 1;
      } while (lVar81 != 3);
      lVar69 = lVar69 + 1;
      local_1130._0_8_ = local_1130._0_8_ + 8;
      local_13e0.
      super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data
           = local_13e0.
             super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>
             .m_data + 0xf;
    } while (lVar69 != 3);
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         (pPVar7->m_storage).m_data.array + 0xc0;
    local_cc8._0_8_ = local_bc0;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_1130._8_8_ = local_cc8;
    local_1130._0_8_ = local_e88;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startRow.
    m_value = 0xc;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_startCol.
    m_value = 0xc;
    pdStack_1120 = &local_e40;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    m_outerStride = 0xf;
    auStack_1110 = auVar97._32_32_;
    pBStack_1118 = &local_13e0;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    local_e88._0_8_ =
         local_13e0.
         super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.
         m_data;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_1130);
    lVar73 = lVar73 + 1;
  } while (lVar73 != 4);
  lVar73 = 0;
  do {
    auVar116._8_8_ = 0;
    auVar116._0_8_ = this->alpha_i[lVar73];
    auVar42._8_8_ = 0x8000000000000000;
    auVar42._0_8_ = 0x8000000000000000;
    auVar92 = vxorpd_avx512vl(auVar116,auVar42);
    local_1180 = 0;
    puStack_1178 = (undefined1 *)0x0;
    uStack_1170 = 0;
    pdStack_1168 = (double *)0x0;
    uStack_1160 = 0;
    uStack_1158 = 0;
    uStack_1150 = 0;
    uStack_1148 = 0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    puStack_11b8 = (undefined1 *)0x0;
    uStack_11b0 = 0;
    pBStack_11a8 = (Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)0x0;
    uStack_11a0 = 0;
    puStack_1198 = (undefined1 *)0x0;
    uStack_1190 = 0;
    puStack_1188 = (undefined1 *)0x0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)&this->stress_i[lVar73].
                   super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>;
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         1.18575755001899e-322;
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(local_1098 + lVar73);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 4.94065645841247e-324;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(0x18,0xc,(const_blas_data_mapper<double,_long,_0> *)&local_1340,
          (const_blas_data_mapper<double,_long,_1> *)&local_1080,(ResScalar *)&local_1200,1,
          auVar92._0_8_ * (double)(&w_i)[lVar73]);
    auVar99._8_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar99._0_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar99._16_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar99._24_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar99._32_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar99._40_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar99._48_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar99._56_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar97 = vmovdqa64_avx512f(auVar99);
    local_b80._8_8_ = puStack_11b8;
    local_b80._0_8_ =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    local_b80._16_8_ = uStack_11b0;
    local_b80._24_8_ = pBStack_11a8;
    local_b80._32_8_ = uStack_11a0;
    local_b80._40_8_ = puStack_1198;
    local_b80._48_8_ = uStack_1190;
    local_b80._56_8_ = puStack_1188;
    local_b40._8_8_ = puStack_1178;
    local_b40._0_8_ = local_1180;
    local_b40._16_8_ = uStack_1170;
    local_b40._24_8_ = pdStack_1168;
    local_b40._32_8_ = uStack_1160;
    local_b40._40_8_ = uStack_1158;
    local_b40._48_8_ = uStack_1150;
    local_b40._56_8_ = uStack_1148;
    _local_bc0 = vmovdqa64_avx512f(auVar97);
    if ((local_10a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
        m_rows < 0x18) goto LAB_0078f12f;
    pdVar60 = (local_10a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
              .m_data;
    if (((ulong)pdVar60 & 7) == 0) {
      auVar97 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar87 = -((uint)((ulong)pdVar60 >> 3) & 0x1fffffff) & 7;
      uVar71 = (ulong)uVar87;
      uVar63 = 0x18 - uVar87;
      uVar88 = (ulong)(uVar63 & 0xfffffff8 | uVar87);
      if (uVar87 != 0) goto LAB_0078e760;
      uVar71 = 0;
LAB_0078e7b4:
      do {
        auVar98 = vaddpd_avx512f(*(undefined1 (*) [64])(local_bc0 + uVar71 * 8),
                                 *(undefined1 (*) [64])(pdVar60 + uVar71));
        *(undefined1 (*) [64])(pdVar60 + uVar71) = auVar98;
        uVar71 = uVar71 + 8;
      } while (uVar71 < uVar88);
    }
    else {
      auVar97 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar88 = 0x18;
      uVar71 = 0x18;
      uVar63 = 0;
LAB_0078e760:
      auVar98 = vpbroadcastq_avx512f();
      uVar83 = 0;
      do {
        auVar103 = vpbroadcastq_avx512f();
        auVar103 = vporq_avx512f(auVar103,auVar97);
        uVar79 = vpcmpuq_avx512f(auVar103,auVar98,2);
        lVar69 = uVar83 * 8;
        bVar56 = (byte)uVar79;
        auVar100._8_8_ = (ulong)((byte)(uVar79 >> 1) & 1) * *(long *)(local_bc0 + lVar69 + 8);
        auVar100._0_8_ = (ulong)(bVar56 & 1) * *(long *)(local_bc0 + lVar69);
        auVar100._16_8_ = (ulong)((byte)(uVar79 >> 2) & 1) * *(long *)(local_bc0 + lVar69 + 0x10);
        auVar100._24_8_ = (ulong)((byte)(uVar79 >> 3) & 1) * (long)(&dStack_ba8)[uVar83];
        auVar100._32_8_ = (ulong)((byte)(uVar79 >> 4) & 1) * (&lStack_ba0)[uVar83];
        auVar100._40_8_ = (ulong)((byte)(uVar79 >> 5) & 1) * (long)adStack_b98[uVar83];
        auVar100._48_8_ = (ulong)((byte)(uVar79 >> 6) & 1) * (long)adStack_b98[uVar83 + 1];
        auVar100._56_8_ = (uVar79 >> 7) * *(long *)(local_b80 + lVar69 + -8);
        pdVar77 = pdVar60 + uVar83;
        auVar101._8_8_ = (ulong)((byte)(uVar79 >> 1) & 1) * (long)pdVar77[1];
        auVar101._0_8_ = (ulong)(bVar56 & 1) * (long)*pdVar77;
        auVar101._16_8_ = (ulong)((byte)(uVar79 >> 2) & 1) * (long)pdVar77[2];
        auVar101._24_8_ = (ulong)((byte)(uVar79 >> 3) & 1) * (long)pdVar77[3];
        auVar101._32_8_ = (ulong)((byte)(uVar79 >> 4) & 1) * (long)pdVar77[4];
        auVar101._40_8_ = (ulong)((byte)(uVar79 >> 5) & 1) * (long)pdVar77[5];
        auVar101._48_8_ = (ulong)((byte)(uVar79 >> 6) & 1) * (long)pdVar77[6];
        auVar101._56_8_ = (uVar79 >> 7) * (long)pdVar77[7];
        auVar103 = vaddpd_avx512f(auVar100,auVar101);
        pdVar77 = pdVar60 + uVar83;
        bVar31 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar32 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar33 = (bool)((byte)(uVar79 >> 3) & 1);
        bVar34 = (bool)((byte)(uVar79 >> 4) & 1);
        bVar35 = (bool)((byte)(uVar79 >> 5) & 1);
        bVar36 = (bool)((byte)(uVar79 >> 6) & 1);
        *pdVar77 = (double)((ulong)(bVar56 & 1) * auVar103._0_8_ |
                           (ulong)!(bool)(bVar56 & 1) * (long)*pdVar77);
        pdVar77[1] = (double)((ulong)bVar31 * auVar103._8_8_ | (ulong)!bVar31 * (long)pdVar77[1]);
        pdVar77[2] = (double)((ulong)bVar32 * auVar103._16_8_ | (ulong)!bVar32 * (long)pdVar77[2]);
        pdVar77[3] = (double)((ulong)bVar33 * auVar103._24_8_ | (ulong)!bVar33 * (long)pdVar77[3]);
        pdVar77[4] = (double)((ulong)bVar34 * auVar103._32_8_ | (ulong)!bVar34 * (long)pdVar77[4]);
        pdVar77[5] = (double)((ulong)bVar35 * auVar103._40_8_ | (ulong)!bVar35 * (long)pdVar77[5]);
        pdVar77[6] = (double)((ulong)bVar36 * auVar103._48_8_ | (ulong)!bVar36 * (long)pdVar77[6]);
        pdVar77[7] = (double)((uVar79 >> 7) * auVar103._56_8_ |
                             (ulong)!SUB81(uVar79 >> 7,0) * (long)pdVar77[7]);
        uVar83 = uVar83 + 8;
      } while (((int)uVar71 + 7U & 0xfffffff8) != uVar83);
      if (7 < uVar63) goto LAB_0078e7b4;
    }
    if (uVar88 < 0x18) {
      uVar71 = (ulong)(uint)((int)uVar88 << 3);
      auVar98 = vpbroadcastq_avx512f();
      uVar88 = vpcmpuq_avx512f(auVar98,auVar97,5);
      bVar56 = (byte)uVar88;
      auVar102._8_8_ = (ulong)((byte)(uVar88 >> 1) & 1) * *(long *)(local_bc0 + uVar71 + 8);
      auVar102._0_8_ = (ulong)(bVar56 & 1) * *(long *)(local_bc0 + uVar71);
      auVar102._16_8_ = (ulong)((byte)(uVar88 >> 2) & 1) * *(long *)(local_bc0 + uVar71 + 0x10);
      auVar102._24_8_ = (ulong)((byte)(uVar88 >> 3) & 1) * *(long *)((long)&dStack_ba8 + uVar71);
      auVar102._32_8_ = (ulong)((byte)(uVar88 >> 4) & 1) * *(long *)((long)&lStack_ba0 + uVar71);
      auVar102._40_8_ = (ulong)((byte)(uVar88 >> 5) & 1) * *(long *)((long)adStack_b98 + uVar71);
      auVar102._48_8_ = (ulong)((byte)(uVar88 >> 6) & 1) * *(long *)((long)adStack_b98 + uVar71 + 8)
      ;
      auVar102._56_8_ = (uVar88 >> 7) * *(long *)(local_b80 + (uVar71 - 8));
      plVar27 = (long *)((long)pdVar60 + uVar71);
      auVar106._8_8_ = (ulong)((byte)(uVar88 >> 1) & 1) * plVar27[1];
      auVar106._0_8_ = (ulong)(bVar56 & 1) * *plVar27;
      auVar106._16_8_ = (ulong)((byte)(uVar88 >> 2) & 1) * plVar27[2];
      auVar106._24_8_ = (ulong)((byte)(uVar88 >> 3) & 1) * plVar27[3];
      auVar106._32_8_ = (ulong)((byte)(uVar88 >> 4) & 1) * plVar27[4];
      auVar106._40_8_ = (ulong)((byte)(uVar88 >> 5) & 1) * plVar27[5];
      auVar106._48_8_ = (ulong)((byte)(uVar88 >> 6) & 1) * plVar27[6];
      auVar106._56_8_ = (uVar88 >> 7) * plVar27[7];
      auVar97 = vaddpd_avx512f(auVar102,auVar106);
      puVar78 = (ulong *)((long)pdVar60 + uVar71);
      bVar31 = (bool)((byte)(uVar88 >> 1) & 1);
      bVar32 = (bool)((byte)(uVar88 >> 2) & 1);
      bVar33 = (bool)((byte)(uVar88 >> 3) & 1);
      bVar34 = (bool)((byte)(uVar88 >> 4) & 1);
      bVar35 = (bool)((byte)(uVar88 >> 5) & 1);
      bVar36 = (bool)((byte)(uVar88 >> 6) & 1);
      *puVar78 = (ulong)(bVar56 & 1) * auVar97._0_8_ | (ulong)!(bool)(bVar56 & 1) * *puVar78;
      puVar78[1] = (ulong)bVar31 * auVar97._8_8_ | (ulong)!bVar31 * puVar78[1];
      puVar78[2] = (ulong)bVar32 * auVar97._16_8_ | (ulong)!bVar32 * puVar78[2];
      puVar78[3] = (ulong)bVar33 * auVar97._24_8_ | (ulong)!bVar33 * puVar78[3];
      puVar78[4] = (ulong)bVar34 * auVar97._32_8_ | (ulong)!bVar34 * puVar78[4];
      puVar78[5] = (ulong)bVar35 * auVar97._40_8_ | (ulong)!bVar35 * puVar78[5];
      puVar78[6] = (ulong)bVar36 * auVar97._48_8_ | (ulong)!bVar36 * puVar78[6];
      puVar78[7] = (uVar88 >> 7) * auVar97._56_8_ | (ulong)!SUB81(uVar88 >> 7,0) * puVar78[7];
    }
    lVar73 = lVar73 + 1;
  } while (lVar73 != 4);
  ChStateDelta::ChStateDelta((ChStateDelta *)local_1298,0x18,(ChIntegrable *)0x0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1f])(this,0,(ChStateDelta *)local_1298);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_1380._8_8_;
  local_1380 = auVar53 << 0x40;
  uVar87 = -((uint)((ulong)(local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array + 3) >> 3) & 0x1fffffff) & 5;
  if (2 < uVar87) {
    uVar87 = 3;
  }
  uVar88 = CONCAT44(0,uVar87 * 8);
  local_1220 = (undefined1 *)
               (ulong)(-((uint)((ulong)(local_1080.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data.array + 6) >> 3) & 0x1fffffff) & 6);
  local_1230._0_8_ = uVar88;
  if ((undefined1 *)0x2 < local_1220) {
    local_1220 = (undefined1 *)0x3;
  }
  local_12b0 = (MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1> *)
               0x0;
  local_1350 = (variable_if_dynamic<long,__1> *)(uVar88 ^ 0x18);
  local_1390 = (double *)0x18;
  uVar71 = CONCAT44(0,(int)local_1220 * 8);
  local_1370._0_8_ = &local_1080;
  local_c00._0_8_ = &local_e40;
  local_1360 = (ChMatrixNM<double,_4,_2> *)(uVar71 ^ 0x18);
  local_1240._0_8_ = uVar71;
  local_c40._0_8_ = (long)local_fe0.m_data + uVar88;
  local_12d0._0_8_ =
       (long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array + uVar88 + 0x18;
  local_c80._0_8_ =
       (long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array + uVar71 + 0x30;
  lVar73 = 0;
  do {
    if ((RhsNested)local_1298._8_8_ != (RhsNested)0x18) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Matrix<double, 12, 24, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 12, 24, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    puStack_11b8 = (undefined1 *)0x0;
    uStack_11b0 = 0;
    pBStack_11a8 = (Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)0x0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_13e0.
    super_BlockImpl<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>,_0>.m_data =
         (double *)0x3ff0000000000000;
    pCVar76 = local_1098 + lVar73;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Matrix<double,12,24,1,12,24>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,12,1,0,12,1>>
              (pCVar76,(Matrix<double,__1,_1,_0,__1,_1> *)local_1298,
               (Matrix<double,_12,_1,_0,_12,_1> *)&local_1200,(Scalar *)&local_13e0);
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    local_12f8 = puStack_11b8;
    uStack_12f0 = uStack_11b0;
    uStack_12e8 = pBStack_11a8;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)&local_1340;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1340;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)&local_13e0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)(local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 3);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1340;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)local_1130,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)(local_1340.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 6);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 2.96439387504748e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1340;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)local_e88,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)&local_12f8;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 4.44659081257122e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1340;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)local_cc8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1200,(type *)0x0);
    dStack_e30 = 0.0;
    local_fe0.m_data[2] = 0.0;
    local_1000.m_data[2] = 0.0;
    local_ea0.m_data[2] = 0.0;
    local_ec0.m_data[2] = 0.0;
    local_10b0 = 0.0;
    local_10d0 = 0.0;
    local_e40 = 0.0;
    dStack_e38 = 0.0;
    local_fe0.m_data[0] = 0.0;
    local_fe0.m_data[1] = 0.0;
    local_1000.m_data[0] = 0.0;
    local_1000.m_data[1] = 0.0;
    local_ea0.m_data[0] = 0.0;
    local_ea0.m_data[1] = 0.0;
    local_ec0.m_data[0] = 0.0;
    local_ec0.m_data[1] = 0.0;
    local_10c0 = ZEXT816(0);
    local_10e0 = ZEXT816(0);
    pLVar62 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_layers).
        super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
        ._M_impl.super__Vector_impl_data._M_finish == pLVar62) {
      local_f40._0_16_ = ZEXT816(0);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_1430._8_8_;
      local_1430._0_16_ = auVar50 << 0x40;
    }
    else {
      local_f40._0_16_ = ZEXT816(0);
      lVar69 = 0;
      uVar88 = 0;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_1430._8_8_;
      local_1430._0_16_ = auVar49 << 0x40;
      do {
        lVar81 = *(long *)((long)&(pLVar62->m_material).
                                  super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + lVar69);
        p_Var28 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(pLVar62->m_material).
                           super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar69);
        if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
          }
        }
        lVar65 = *(long *)(lVar81 + 0x28);
        p_Var30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar81 + 0x30);
        if (p_Var30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var30->_M_use_count = p_Var30->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var30->_M_use_count = p_Var30->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var30);
        }
        if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var28);
        }
        pLVar62 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (lVar65 != 0) {
          lVar81 = *(long *)((long)&(pLVar62->m_material).
                                    super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar69);
          p_Var28 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(pLVar62->m_material).
                             super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + lVar69);
          if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
            }
          }
          plVar27 = *(long **)(lVar81 + 0x28);
          p_Var30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar81 + 0x30);
          if (p_Var30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var30->_M_use_count = p_Var30->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var30->_M_use_count = p_Var30->_M_use_count + 1;
            }
          }
          pdVar29 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          (**(code **)(*plVar27 + 0x10))
                    (pdVar29[uVar88],pdVar29[uVar88 + 1],
                     *(undefined8 *)
                      ((long)&((this->m_layers).
                               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_theta + lVar69),plVar27
                     ,&local_ea0,&local_ec0,local_10c0,local_10e0,&local_13e0,local_1130,local_e88,
                     local_cc8);
          if (p_Var30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var30);
          }
          if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var28);
          }
          local_e40 = local_ea0.m_data[0] + local_e40;
          dStack_e38 = local_ea0.m_data[1] + dStack_e38;
          dStack_e30 = local_ea0.m_data[2] + dStack_e30;
          local_fe0.m_data[0] = local_ec0.m_data[0] + local_fe0.m_data[0];
          local_fe0.m_data[1] = local_ec0.m_data[1] + local_fe0.m_data[1];
          local_fe0.m_data[2] = local_ec0.m_data[2] + local_fe0.m_data[2];
          local_1000.m_data[0] = (double)local_10c0._0_8_ + local_1000.m_data[0];
          local_1000.m_data[1] = (double)local_10c0._8_8_ + local_1000.m_data[1];
          local_1000.m_data[2] = local_10b0 + local_1000.m_data[2];
          pLVar62 = (this->m_layers).
                    super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_f40._8_8_ = (double)local_f40._8_8_ + (double)local_10e0._8_8_;
          local_f40._0_8_ = (double)local_f40._0_8_ + (double)local_10e0._0_8_;
          local_1430._0_8_ = (double)local_1430._0_8_ + local_10d0;
        }
        uVar88 = uVar88 + 1;
        lVar69 = lVar69 + 0x28;
      } while (uVar88 < (ulong)(((long)(this->m_layers).
                                       super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar62 >>
                                3) * -0x3333333333333333));
    }
    if (local_1380._0_8_ != 0) {
      memcpy(&local_1080,&local_e40,(size_t)local_12b0);
    }
    memcpy((void *)local_1370._0_8_,(void *)local_c00._0_8_,(size_t)local_1390);
    memcpy(local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array + 3,&local_fe0,local_1230._0_8_);
    if (uVar87 != 3) {
      memcpy((void *)local_12d0._0_8_,(void *)local_c40._0_8_,(size_t)local_1350);
    }
    memcpy(local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array + 6,&local_1000,local_1240._0_8_);
    if ((int)local_1220 != 3) {
      memcpy((void *)local_c80._0_8_,(void *)((long)local_1000.m_data + uVar71),(size_t)local_1360);
    }
    local_1038 = local_f40._0_8_;
    uStack_1030 = local_f40._8_8_;
    local_1028 = local_1430._0_8_;
    if ((local_10a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
        m_rows < 0x18) {
LAB_0078f12f:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar60 = (local_10a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
              .m_data;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = this->alpha_i[lVar73];
    local_1180 = 0;
    puStack_1178 = (undefined1 *)0x0;
    uStack_1170 = 0;
    pdStack_1168 = (double *)0x0;
    uStack_1160 = 0;
    uStack_1158 = 0;
    uStack_1150 = 0;
    uStack_1148 = 0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    puStack_11b8 = (undefined1 *)0x0;
    uStack_11b0 = 0;
    pBStack_11a8 = (Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)0x0;
    uStack_11a0 = 0;
    puStack_1198 = (undefined1 *)0x0;
    uStack_1190 = 0;
    puStack_1188 = (undefined1 *)0x0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_1020.m_stride = 0x18;
    local_1020.m_data = (double *)pCVar76;
    auVar43._8_8_ = 0x8000000000000000;
    auVar43._0_8_ = 0x8000000000000000;
    auVar92 = vxorpd_avx512vl(auVar117,auVar43);
    local_ee0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = (double *)&local_1080;
    local_ee0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(0x18,0xc,(const_blas_data_mapper<double,_long,_0> *)&local_1020,&local_ee0,
          (ResScalar *)&local_1200,1,auVar92._0_8_ * (double)(&w_i)[lVar73]);
    if (((ulong)pdVar60 & 7) == 0) {
      uVar63 = -((uint)((ulong)pdVar60 >> 3) & 0x1fffffff) & 7;
      uVar83 = (ulong)uVar63;
      uVar86 = 0x18 - uVar63;
      uVar88 = (ulong)(uVar86 & 0xfffffff8 | uVar63);
      if (uVar63 != 0) goto LAB_0078f03d;
      uVar83 = 0;
LAB_0078f073:
      do {
        auVar97 = vaddpd_avx512f(*(undefined1 (*) [64])
                                  (local_1200.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + uVar83),
                                 *(undefined1 (*) [64])(pdVar60 + uVar83));
        *(undefined1 (*) [64])(pdVar60 + uVar83) = auVar97;
        uVar83 = uVar83 + 8;
      } while (uVar83 < uVar88);
    }
    else {
      uVar88 = 0x18;
      uVar83 = 0x18;
      uVar86 = 0;
LAB_0078f03d:
      uVar79 = 0;
      do {
        pdVar60[uVar79] =
             local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array[uVar79] + pdVar60[uVar79];
        uVar79 = uVar79 + 1;
      } while (uVar83 != uVar79);
      if (7 < uVar86) goto LAB_0078f073;
    }
    if (uVar88 < 0x18) {
      do {
        pdVar60[uVar88] =
             local_1200.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array[uVar88] + pdVar60[uVar88];
        uVar88 = uVar88 + 1;
      } while (uVar88 != 0x18);
    }
    lVar73 = lVar73 + 1;
    if (lVar73 == 4) {
      if ((non_const_type)local_1298._0_8_ != (non_const_type)0x0) {
        free((void *)(((non_const_type)(local_1298._0_8_ + -0x48))->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                     array[8]);
      }
      return;
    }
  } while( true );
}

Assistant:

void ChElementShellReissner4::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    Fi.setZero();

    UpdateNodalAndAveragePosAndOrientation();
    InterpolateOrientation();

    /*
	for (unsigned int i = 1; i <= iGetNumDof(); i++) {
		beta(i) = XCurr(iFirstReactionIndex + i);
	}
    */  //***TODO*** EAS internal variables not yet implemented

    ComputeIPCurvature();
    for (int i = 0; i < NUMIP; i++) {
        InterpDeriv(xa, L_alpha_beta_i[i], y_i_1[i], y_i_2[i]);
        eps_tilde_1_i[i] = T_i[i].transpose() * y_i_1[i] - eps_tilde_1_0_i[i];
        eps_tilde_2_i[i] = T_i[i].transpose() * y_i_2[i] - eps_tilde_2_0_i[i];
        k_tilde_1_i[i] = T_i[i].transpose() * k_1_i[i] - k_tilde_1_0_i[i];
        k_tilde_2_i[i] = T_i[i].transpose() * k_2_i[i] - k_tilde_2_0_i[i];

        ChStarMatrix33<> myi_1_X(y_i_1[i]);
        ChStarMatrix33<> myi_2_X(y_i_2[i]);
        ChStarMatrix33<> mk_1_X(k_1_i[i]);
        ChStarMatrix33<> mk_2_X(k_2_i[i]);
        ChMatrix33<> block;

        // parte variabile di B_overline_i
        for (int n = 0; n < NUMNODES; n++) {
            ChMatrix33<> Phi_Delta_i_n_LI_i = Phi_Delta_i[i][n] * LI[n](xi_i[i]);

            // delta epsilon_tilde_1_i
            block = T_i[i] * L_alpha_beta_i[i](n, 0);
            B_overline_i[i].block(0, 6 * n, 3, 3) = block.transpose();
            block = T_i[i].transpose() * myi_1_X * Phi_Delta_i_n_LI_i;
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(0, 3 + 6 * n, 3, 3) = block;

            // delta epsilon_tilde_2_i
            block = T_i[i] * L_alpha_beta_i[i](n, 1);
            B_overline_i[i].block(3, 6 * n, 3, 3) = block.transpose();
            block = T_i[i].transpose() * myi_2_X * Phi_Delta_i_n_LI_i;
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(3, 3 + 6 * n, 3, 3) = block;

            ChVector<> phi_tilde_1_i;
            ChVector<> phi_tilde_2_i;
            InterpDeriv(phi_tilde_n, L_alpha_beta_i[i], phi_tilde_1_i, phi_tilde_2_i);

            // delta k_tilde_1_i
            block = T_i[i].transpose() * mk_1_X * Phi_Delta_i_n_LI_i + T_i[i].transpose() * Kappa_delta_i_1[i][n];
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(6, 3 + 6 * n, 3, 3) = block;

            // delta k_tilde_2_i
            block = T_i[i].transpose() * mk_2_X * Phi_Delta_i_n_LI_i + T_i[i].transpose() * Kappa_delta_i_2[i][n];
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(9, 3 + 6 * n, 3, 3) = block;

            // delta y_alpha_1
            block = ChMatrix33<>::Identity() * L_alpha_beta_i[i](n, 0);
            D_overline_i[i].block(0, 6 * n, 3, 3) = block;

            // delta y_alpha_2
            block = ChMatrix33<>::Identity() * L_alpha_beta_i[i](n, 1);
            D_overline_i[i].block(3, 6 * n, 3, 3) = block;

            // delta k_1_i
            block = Kappa_delta_i_1[i][n] * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(6, 3 + 6 * n, 3, 3) = block;

            // delta k_2_i
            block = Kappa_delta_i_2[i][n] * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(9, 3 + 6 * n, 3, 3) = block;

            // phi_delta
            block = Phi_Delta_i_n_LI_i * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(12, 3 + 6 * n, 3, 3) = block;
        }
    }

// ANS
#ifdef CHUSE_ANS

    ChMatrixNM<double, 6, 24> B_overline_A;
    ChVector<> y_A_1;
    ChVector<> y_A_2;
    ChMatrixNM<double, 4, 24> B_overline_3_ABCD;
    ChMatrixNM<double, 4, 24> B_overline_6_ABCD;

    for (int i = 0; i < NUMSSEP; i++) {
        B_overline_A.setZero();
        InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
        eps_tilde_1_A[i] = T_A[i].transpose() * y_A_1 - eps_tilde_1_0_A[i];
        eps_tilde_2_A[i] = T_A[i].transpose() * y_A_2 - eps_tilde_2_0_A[i];

        ChStarMatrix33<> myA_1_X(y_A_1);
        ChStarMatrix33<> myA_2_X(y_A_2);
        ChMatrix33<> block;

        for (int n = 0; n < NUMNODES; n++) {
            ChMatrix33<> Phi_Delta_A_n_LI_i = Phi_Delta_A[i][n] * LI[n](xi_A[i]);

            // delta epsilon_tilde_1_A
            block = T_A[i].transpose() * L_alpha_beta_A[i](n, 0);
            B_overline_A.block(0, 6 * n, 3, 3) = block;
            block = T_A[i].transpose() * myA_1_X * Phi_Delta_A_n_LI_i;
            block = block * this->m_nodes[n]->GetA();  //***NEEDED because in chrono rotations are body-relative
            B_overline_A.block(0, 3 + 6 * n, 3, 3) = block;

            // delta epsilon_tilde_2_A
            block = T_A[i].transpose() * L_alpha_beta_A[i](n, 1);
            B_overline_A.block(3, 6 * n, 3, 3) = block;
            block = T_A[i].transpose() * myA_2_X * Phi_Delta_A_n_LI_i;
            block = block * this->m_nodes[n]->GetA();  //***NEEDED because in chrono rotations are body-relative
            B_overline_A.block(3, 3 + 6 * n, 3, 3) = block;
        }

        B_overline_3_ABCD.row(i) = B_overline_A.row(2);
        B_overline_6_ABCD.row(i) = B_overline_A.row(5);
    }

    for (int i = 0; i < NUMIP; i++) {
        ChMatrixNM<double, 1, 4> sh1;
        ChMatrixNM<double, 1, 4> sh2;
        sh1(0, 0) = (1. + xi_i[i][1]) * 0.5;
        sh1(0, 1) = 0;
        sh1(0, 2) = (1. - xi_i[i][1]) * 0.5;
        sh1(0, 3) = 0;

        sh2(0, 0) = 0;
        sh2(0, 1) = (1. - xi_i[i][0]) * 0.5;
        sh2(0, 2) = 0;
        sh2(0, 3) = (1. + xi_i[i][0]) * 0.5;

        eps_tilde_1_i[i].z() = sh1(0, 0) * eps_tilde_1_A[0].z() + sh1(0, 2) * eps_tilde_1_A[2].z();
        eps_tilde_2_i[i].z() = sh2(0, 1) * eps_tilde_2_A[1].z() + sh2(0, 3) * eps_tilde_2_A[3].z();

        B_overline_i[i].row(2) = sh1 * B_overline_3_ABCD;
        B_overline_i[i].row(5) = sh2 * B_overline_6_ABCD;
    }

#endif

    // EAS: B membranali
    // 	{
    // 		int tmpidx1[5] = {0, 1, 5, 4, 2};
    // 		for (int i = 0; i < NUMIP; i++) {
    // 			for (int n = 1; n <= 4; n++) {
    //#if 0
    // 				CopyMatrixRow(B_overline_m_i[i], n, B_overline_i[i], tmpidx1[n]);
    //#endif
    // 				B_overline_m_i[i].CopyMatrixRow(n, B_overline_i[i], tmpidx1[n]);
    // 			}
    // 		}
    // 	}

    /* Calcola le azioni interne */
    for (int i = 0; i < NUMIP; i++) {
        epsilon.segment(0, 3) = eps_tilde_1_i[i].eigen();
        epsilon.segment(3, 3) = eps_tilde_2_i[i].eigen();
        epsilon.segment(6, 3) = k_tilde_1_i[i].eigen();
        epsilon.segment(9, 3) = k_tilde_2_i[i].eigen();

        //***TODO*** add the EAS effect using the epsilon_hat
        // epsilon_hat = P_i[i] * beta;
        // epsilon += epsilon_hat;

        ChVector<> eps_tot_1(epsilon.segment(0, 3));
        ChVector<> eps_tot_2(epsilon.segment(3, 3));
        ChVector<> k_tot_1(epsilon.segment(6, 3));
        ChVector<> k_tot_2(epsilon.segment(9, 3));

        // Compute strains using
        // constitutive law of material

        ChVector<> n1, n2, m1, m2;
        ChVector<> l_n1, l_n2, l_m1, l_m2;
        // loop on layers
        for (size_t il = 0; il < this->m_layers.size(); ++il) {
            // compute layer stresses (per-unit-length forces and torques), and accumulate
            m_layers[il].GetMaterial()->ComputeStress(l_n1, l_n2, l_m1, l_m2, eps_tot_1, eps_tot_2, k_tot_1, k_tot_2,
                                                      m_layers_z[il], m_layers_z[il + 1], m_layers[il].Get_theta());
            n1 += l_n1;
            n2 += l_n2;
            m1 += l_m1;
            m2 += l_m2;
        }

        stress_i[i].segment(0,3) = n1.eigen();
        stress_i[i].segment(3,3) = n2.eigen();
        stress_i[i].segment(6,3) = m1.eigen();
        stress_i[i].segment(9,3) = m2.eigen();

        ChMatrix33<> Hh;
        ChVector<> Tn1 = T_i[i] * n1;
        ChVector<> Tn2 = T_i[i] * n2;
        ChVector<> Tm1 = T_i[i] * m1;
        ChVector<> Tm2 = T_i[i] * m2;
        Hh = TensorProduct(Tn1, y_i_1[i]) - ChMatrix33<>(Tn1 ^ y_i_1[i]) + TensorProduct(Tn2, y_i_2[i]) -
             ChMatrix33<>(Tn2 ^ y_i_2[i]) + TensorProduct(Tm1, k_1_i[i]) - ChMatrix33<>(Tm1 ^ k_1_i[i]) +
             TensorProduct(Tm2, k_2_i[i]) - ChMatrix33<>(Tm2 ^ k_2_i[i]);

        ChStarMatrix33<> Tn1_tilde(Tn1);
        ChStarMatrix33<> Tn2_tilde(Tn2);
        ChStarMatrix33<> Tm1_tilde(Tm1);
        ChStarMatrix33<> Tm2_tilde(Tm2);

        G_i[i].block(12, 0, 3, 3) = Tn1_tilde;
        G_i[i].block(12, 3, 3, 3) = Tn2_tilde;
        G_i[i].block(12, 6, 3, 3) = Tm1_tilde;
        G_i[i].block(12, 9, 3, 3) = Tm2_tilde;
        G_i[i].block(0, 12, 3, 3) = Tn1_tilde.transpose();
        G_i[i].block(3, 12, 3, 3) = Tn2_tilde.transpose();
        G_i[i].block(12, 12, 3, 3) = Hh;
    }

    // Residual

    ChVectorN<double, 24> rd;
    for (int i = 0; i < NUMIP; i++) {
        rd = (-alpha_i[i] * w_i[i]) * B_overline_i[i].transpose() * stress_i[i];
        Fi.segment(0, 24) += rd;

#ifdef CHUSE_EAS
        double dCoef = 1.0;  //***TODO*** autoset this
        ChVectorN<double, IDOFS> rbeta;
        rbeta = (-alpha_i[i] * w_i[i] / dCoef) * P_i[i].transpose() * stress_i[i];
        Fi.segment(24, IDOFS) = rbeta;
#endif
    }

    // Add damping: 

    // fills velocities with speeds of nodes:
    // {dxdt_1, angular_vel_1,  dxdt_2, angular_vel_2, ...}
    // Note that angular velocities are in node local frame because in C::E angular
    // increments are assumed in local frame csys.
    ChStateDelta velocities(24, nullptr);
    this->LoadableGetStateBlock_w(0, velocities);

    // Note that, in case of ChDampingReissnerRayleigh (rayleigh damping), this
	// is like computing Fi_damping = -beta*[Km]*v   without explicitly building [Km],
    // rather exploit the factorization B'CB, as:
    //   Alpha*[Km]*v = beta * [sum_integraton_points ( [B_i]'*[C]*[B_i] * a_i * w_i )] *v
    //   Alpha*[Km]*v = sum_integraton_points ( [B_i]' * (beta * [C]*[B_i] *v) * a_i * w_i )
    //   Alpha*[Km]*v = sum_integraton_points ( [B_i]' * (   stress_damp_i    ) * a_i * w_i )
    // where for convenience we denoted stress_damp = beta*[C]*[B_i]*v

    ChVectorN<double, 12> strain_dt;
    ChVectorN<double, 12> stress_damp;

    for (int i = 0; i < NUMIP; i++) {
			
        strain_dt = B_overline_i[i] * velocities;  // [B_i] *v

        ChVector<> eps_dt_1(strain_dt.segment(0, 3));
        ChVector<> eps_dt_2(strain_dt.segment(3, 3));
        ChVector<> k_dt_1(strain_dt.segment(6, 3));
        ChVector<> k_dt_2(strain_dt.segment(9, 3));
        ChVector<> n1, n2, m1, m2;
        ChVector<> l_n1, l_n2, l_m1, l_m2;
        // loop on layers
        for (size_t il = 0; il < this->m_layers.size(); ++il) {

			if (m_layers[il].GetMaterial()->GetDamping()) {

				// compute layer stresses (per-unit-length forces and torques), and accumulate  [C]*[B_i]*v
				m_layers[il].GetMaterial()->GetDamping()->ComputeStress(l_n1, l_n2, l_m1, l_m2, eps_dt_1, eps_dt_2, k_dt_1, k_dt_2,
					m_layers_z[il], m_layers_z[il + 1], m_layers[il].Get_theta());
				n1 += l_n1;
				n2 += l_n2;
				m1 += l_m1;
				m2 += l_m2;
			}
        }
        stress_damp.segment(0, 3) = n1.eigen();
        stress_damp.segment(3, 3) = n2.eigen();
        stress_damp.segment(6, 3) = m1.eigen();
        stress_damp.segment(9, 3) = m2.eigen();

        Fi.segment(0, 24) += (-alpha_i[i] * w_i[i]) * B_overline_i[i].transpose() * stress_damp;
    }


}